

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_decoder.c
# Opt level: O2

lzma_ret lzma_decode(void *coder_ptr,lzma_dict *dictptr,uint8_t *in,size_t *in_pos,size_t in_size)

{
  byte *pbVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  undefined4 uVar5;
  size_t sVar6;
  ulong uVar7;
  uint8_t *puVar8;
  size_t sVar9;
  byte bVar10;
  short sVar11;
  bool bVar12;
  bool bVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  size_t sVar17;
  ulong uVar18;
  uint uVar19;
  size_t sVar20;
  uint uVar21;
  ulong uVar22;
  void *pvVar23;
  uint uVar24;
  ushort *puVar25;
  size_t sVar26;
  uint8_t *__src;
  long lVar27;
  uint8_t *__dest;
  lzma_lzma_state lVar28;
  lzma_ret lVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  size_t local_f8;
  ulong local_f0;
  uint local_c8;
  uint local_c4;
  ulong local_b8;
  size_t local_a8;
  uint local_9c;
  
  iVar14 = *(int *)((long)coder_ptr + 0x6e74);
  while (iVar14 = iVar14 + -1, iVar14 != -1) {
    sVar6 = *in_pos;
    if (sVar6 == in_size) {
      return LZMA_OK;
    }
    uVar31 = (uint)in[sVar6];
    if ((iVar14 == 4) && (uVar31 = 0, in[sVar6] != 0)) {
      return LZMA_DATA_ERROR;
    }
    *(uint *)((long)coder_ptr + 0x6e70) = *(int *)((long)coder_ptr + 0x6e70) << 8 | uVar31;
    *in_pos = sVar6 + 1;
    *(int *)((long)coder_ptr + 0x6e74) = iVar14;
  }
  sVar6 = dictptr->pos;
  local_a8 = dictptr->full;
  sVar26 = dictptr->limit;
  uVar31 = *(uint *)((long)coder_ptr + 0x6e6c);
  uVar15 = *(uint *)((long)coder_ptr + 0x6e70);
  local_f8 = *in_pos;
  lVar28 = *(lzma_lzma_state *)((long)coder_ptr + 0x6e78);
  uVar33 = (ulong)*(uint *)((long)coder_ptr + 0x6e7c);
  local_c4 = *(uint *)((long)coder_ptr + 0x6e80);
  local_c8 = *(uint *)((long)coder_ptr + 0x6e84);
  local_9c = *(uint *)((long)coder_ptr + 0x6e88);
  pvVar23 = *(void **)((long)coder_ptr + 0x6ea8);
  uVar22 = (ulong)*(uint *)((long)coder_ptr + 0x6eb0);
  uVar7 = *(ulong *)((long)coder_ptr + 0x6e98);
  sVar20 = uVar7 + sVar6;
  if (sVar26 - sVar6 <= uVar7) {
    sVar20 = sVar26;
  }
  if (uVar7 == 0xffffffffffffffff) {
    sVar20 = sVar26;
  }
  uVar30 = *(uint *)((long)coder_ptr + 0x6eb4);
  uVar16 = *(uint *)((long)coder_ptr + 0x6eb8);
  uVar21 = *(uint *)((long)coder_ptr + 0x6ebc);
  local_f0 = (ulong)uVar21;
  sVar26 = sVar6;
  if (*(uint *)((long)coder_ptr + 0x6ea0) < 0x47) {
    puVar8 = dictptr->buf;
    sVar9 = dictptr->size;
    uVar3 = *(uint *)((long)coder_ptr + 0x6e8c);
    uVar4 = *(uint *)((long)coder_ptr + 0x6e94);
    uVar5 = *(undefined4 *)((long)coder_ptr + 0x6e90);
    local_b8 = (ulong)((uint)sVar6 & uVar3);
    uVar18 = uVar33;
    uVar35 = uVar22;
    uVar34 = uVar22;
    uVar24 = uVar15;
    uVar32 = uVar15;
    uVar21 = uVar16;
    switch(*(uint *)((long)coder_ptr + 0x6ea0)) {
    default:
      do {
        if ((uVar7 != 0xffffffffffffffff) && (sVar26 == sVar20)) {
          uVar21 = (uint)local_f0;
          sVar26 = sVar20;
          goto LAB_00178371;
        }
        uVar21 = uVar31;
        if (uVar31 < 0x1000000) {
          if (local_f8 == in_size) {
            *(undefined4 *)((long)coder_ptr + 0x6ea0) = 1;
            local_f8 = in_size;
            goto LAB_0017b237;
          }
          pbVar1 = in + local_f8;
          local_f8 = local_f8 + 1;
          uVar15 = uVar15 << 8 | (uint)*pbVar1;
          uVar21 = uVar31 << 8;
        }
        puVar25 = (ushort *)((long)coder_ptr + local_b8 * 2 + (ulong)lVar28 * 0x20 + 0x6000);
        uVar2 = *puVar25;
        uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
        uVar32 = uVar15 - uVar31;
        if (uVar15 < uVar31) {
          *puVar25 = (short)(0x800 - uVar2 >> 5) + uVar2;
          bVar10 = (byte)uVar5;
          sVar17 = 0;
          if (sVar26 == 0) {
            sVar17 = sVar9;
          }
          pvVar23 = (void *)(((ulong)(puVar8[(sVar17 - 1) + sVar26] >> (8 - bVar10 & 0x1f)) +
                             ((ulong)((uint)sVar26 & uVar4) << (bVar10 & 0x3f))) * 0x600 +
                            (long)coder_ptr);
          uVar22 = 1;
          if (lVar28 < STATE_LIT_MATCH) {
switchD_0017835c_caseD_2:
            uVar21 = uVar31;
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 2;
                local_f8 = in_size;
                goto LAB_0017b237;
              }
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar15 = uVar15 << 8 | (uint)*pbVar1;
              uVar21 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)pvVar23 + uVar22 * 2);
            uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
            uVar24 = (int)uVar22 * 2;
            uVar35 = (ulong)uVar24;
            uVar32 = uVar15 - uVar31;
            if (uVar15 < uVar31) {
              *(ushort *)((long)pvVar23 + uVar22 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar32 = uVar15;
            }
            else {
              uVar31 = uVar21 - uVar31;
              *(ushort *)((long)pvVar23 + uVar22 * 2) = uVar2 - (uVar2 >> 5);
              uVar35 = (ulong)(uVar24 | 1);
            }
switchD_0017835c_caseD_3:
            uVar21 = uVar31;
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 3;
                local_f8 = in_size;
                uVar22 = uVar35;
                uVar15 = uVar32;
                goto LAB_0017b237;
              }
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar32 = uVar32 << 8 | (uint)*pbVar1;
              uVar21 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)pvVar23 + uVar35 * 2);
            uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
            uVar24 = (int)uVar35 * 2;
            uVar34 = (ulong)uVar24;
            uVar15 = uVar32 - uVar31;
            if (uVar32 < uVar31) {
              *(ushort *)((long)pvVar23 + uVar35 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar15 = uVar32;
            }
            else {
              uVar31 = uVar21 - uVar31;
              *(ushort *)((long)pvVar23 + uVar35 * 2) = uVar2 - (uVar2 >> 5);
              uVar34 = (ulong)(uVar24 | 1);
            }
switchD_0017835c_caseD_4:
            uVar21 = uVar31;
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 4;
                local_f8 = in_size;
                uVar22 = uVar34;
                goto LAB_0017b237;
              }
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar15 = uVar15 << 8 | (uint)*pbVar1;
              uVar21 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)pvVar23 + uVar34 * 2);
            uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
            uVar24 = (int)uVar34 * 2;
            uVar22 = (ulong)uVar24;
            uVar32 = uVar15 - uVar31;
            if (uVar15 < uVar31) {
              *(ushort *)((long)pvVar23 + uVar34 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar32 = uVar15;
            }
            else {
              uVar31 = uVar21 - uVar31;
              *(ushort *)((long)pvVar23 + uVar34 * 2) = uVar2 - (uVar2 >> 5);
              uVar22 = (ulong)(uVar24 | 1);
            }
switchD_0017835c_caseD_5:
            uVar21 = uVar31;
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 5;
                local_f8 = in_size;
                uVar15 = uVar32;
                goto LAB_0017b237;
              }
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar32 = uVar32 << 8 | (uint)*pbVar1;
              uVar21 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)pvVar23 + uVar22 * 2);
            uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
            uVar24 = (int)uVar22 * 2;
            uVar34 = (ulong)uVar24;
            uVar15 = uVar32 - uVar31;
            if (uVar32 < uVar31) {
              *(ushort *)((long)pvVar23 + uVar22 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar15 = uVar32;
            }
            else {
              uVar31 = uVar21 - uVar31;
              *(ushort *)((long)pvVar23 + uVar22 * 2) = uVar2 - (uVar2 >> 5);
              uVar34 = (ulong)(uVar24 | 1);
            }
switchD_0017835c_caseD_6:
            uVar21 = uVar31;
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 6;
                local_f8 = in_size;
                uVar22 = uVar34;
                goto LAB_0017b237;
              }
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar15 = uVar15 << 8 | (uint)*pbVar1;
              uVar21 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)pvVar23 + uVar34 * 2);
            uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
            uVar24 = (int)uVar34 * 2;
            uVar22 = (ulong)uVar24;
            uVar32 = uVar15 - uVar31;
            if (uVar15 < uVar31) {
              *(ushort *)((long)pvVar23 + uVar34 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar32 = uVar15;
            }
            else {
              uVar31 = uVar21 - uVar31;
              *(ushort *)((long)pvVar23 + uVar34 * 2) = uVar2 - (uVar2 >> 5);
              uVar22 = (ulong)(uVar24 | 1);
            }
switchD_0017835c_caseD_7:
            uVar21 = uVar31;
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 7;
                local_f8 = in_size;
                uVar15 = uVar32;
                goto LAB_0017b237;
              }
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar32 = (uint)*pbVar1 | uVar32 << 8;
              uVar21 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)pvVar23 + uVar22 * 2);
            uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
            uVar24 = (int)uVar22 * 2;
            uVar34 = (ulong)uVar24;
            uVar15 = uVar32 - uVar31;
            if (uVar32 < uVar31) {
              *(ushort *)((long)pvVar23 + uVar22 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar15 = uVar32;
            }
            else {
              uVar31 = uVar21 - uVar31;
              *(ushort *)((long)pvVar23 + uVar22 * 2) = uVar2 - (uVar2 >> 5);
              uVar34 = (ulong)(uVar24 | 1);
            }
switchD_0017835c_caseD_8:
            uVar21 = uVar31;
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 8;
                local_f8 = in_size;
                uVar22 = uVar34;
                goto LAB_0017b237;
              }
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar15 = (uint)*pbVar1 | uVar15 << 8;
              uVar21 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)pvVar23 + uVar34 * 2);
            uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
            uVar24 = (int)uVar34 * 2;
            uVar22 = (ulong)uVar24;
            uVar32 = uVar15 - uVar31;
            if (uVar15 < uVar31) {
              *(ushort *)((long)pvVar23 + uVar34 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar32 = uVar15;
            }
            else {
              uVar31 = uVar21 - uVar31;
              *(ushort *)((long)pvVar23 + uVar34 * 2) = uVar2 - (uVar2 >> 5);
              uVar22 = (ulong)(uVar24 | 1);
            }
switchD_0017835c_caseD_9:
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 9;
                local_f8 = in_size;
                uVar15 = uVar32;
                goto LAB_0017b237;
              }
              uVar31 = uVar31 << 8;
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar32 = (uint)*pbVar1 | uVar32 << 8;
            }
            uVar2 = *(ushort *)((long)pvVar23 + uVar22 * 2);
            uVar21 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar15 = (int)uVar22 * 2;
            uVar34 = (ulong)uVar15;
            if (uVar32 < uVar21) {
              *(ushort *)((long)pvVar23 + uVar22 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar15 = uVar32;
              uVar31 = uVar21;
            }
            else {
              *(ushort *)((long)pvVar23 + uVar22 * 2) = uVar2 - (uVar2 >> 5);
              uVar34 = (ulong)(uVar15 | 1);
              uVar15 = uVar32 - uVar21;
              uVar31 = uVar31 - uVar21;
            }
          }
          else {
            sVar17 = 0;
            if (sVar26 <= uVar33) {
              sVar17 = sVar9;
            }
            local_f0 = (ulong)((uint)puVar8[sVar17 + ~uVar33 + sVar26] * 2);
            uVar16 = 0x100;
            uVar22 = 1;
switchD_0017835c_caseD_a:
            uVar21 = uVar16 & (uint)local_f0;
            uVar32 = uVar15;
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 10;
                bVar13 = false;
                bVar12 = true;
                lVar29 = LZMA_OK;
                local_f8 = in_size;
                uVar18 = uVar33;
                goto LAB_0017b246;
              }
              uVar31 = uVar31 << 8;
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar32 = (uint)*pbVar1 | uVar15 << 8;
            }
            uVar34 = (ulong)(uVar16 + (int)uVar22 + uVar21);
            uVar2 = *(ushort *)((long)pvVar23 + uVar34 * 2);
            uVar19 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar24 = (int)uVar22 * 2;
            uVar15 = uVar32 - uVar19;
            if (uVar32 < uVar19) {
              sVar11 = (short)(0x800 - uVar2 >> 5);
              uVar21 = uVar21 ^ uVar16;
              uVar15 = uVar32;
              uVar31 = uVar19;
            }
            else {
              uVar31 = uVar31 - uVar19;
              sVar11 = -(uVar2 >> 5);
              uVar24 = uVar24 | 1;
            }
            uVar22 = (ulong)uVar24;
            *(ushort *)((long)pvVar23 + uVar34 * 2) = sVar11 + uVar2;
            local_f0 = (ulong)((uint)local_f0 * 2);
switchD_0017835c_caseD_b:
            uVar16 = uVar21 & (uint)local_f0;
            uVar32 = uVar15;
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0xb;
                local_f8 = in_size;
                uVar16 = uVar21;
                goto LAB_0017b237;
              }
              uVar31 = uVar31 << 8;
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar32 = (uint)*pbVar1 | uVar15 << 8;
            }
            uVar34 = (ulong)(uVar21 + (int)uVar22 + uVar16);
            uVar2 = *(ushort *)((long)pvVar23 + uVar34 * 2);
            uVar19 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar24 = (int)uVar22 * 2;
            uVar15 = uVar32 - uVar19;
            if (uVar32 < uVar19) {
              sVar11 = (short)(0x800 - uVar2 >> 5);
              uVar16 = uVar16 ^ uVar21;
              uVar15 = uVar32;
              uVar31 = uVar19;
            }
            else {
              uVar31 = uVar31 - uVar19;
              sVar11 = -(uVar2 >> 5);
              uVar24 = uVar24 | 1;
            }
            uVar22 = (ulong)uVar24;
            *(ushort *)((long)pvVar23 + uVar34 * 2) = sVar11 + uVar2;
            local_f0 = (ulong)((uint)local_f0 * 2);
switchD_0017835c_caseD_c:
            uVar21 = uVar16 & (uint)local_f0;
            uVar32 = uVar15;
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0xc;
                local_f8 = in_size;
                goto LAB_0017b237;
              }
              uVar31 = uVar31 << 8;
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar32 = (uint)*pbVar1 | uVar15 << 8;
            }
            uVar34 = (ulong)(uVar16 + (int)uVar22 + uVar21);
            uVar2 = *(ushort *)((long)pvVar23 + uVar34 * 2);
            uVar19 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar24 = (int)uVar22 * 2;
            uVar15 = uVar32 - uVar19;
            if (uVar32 < uVar19) {
              sVar11 = (short)(0x800 - uVar2 >> 5);
              uVar21 = uVar21 ^ uVar16;
              uVar15 = uVar32;
              uVar31 = uVar19;
            }
            else {
              uVar31 = uVar31 - uVar19;
              sVar11 = -(uVar2 >> 5);
              uVar24 = uVar24 | 1;
            }
            uVar22 = (ulong)uVar24;
            *(ushort *)((long)pvVar23 + uVar34 * 2) = sVar11 + uVar2;
            local_f0 = (ulong)((uint)local_f0 * 2);
switchD_0017835c_caseD_d:
            uVar16 = uVar21 & (uint)local_f0;
            uVar32 = uVar15;
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0xd;
                local_f8 = in_size;
                uVar16 = uVar21;
                goto LAB_0017b237;
              }
              uVar31 = uVar31 << 8;
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar32 = (uint)*pbVar1 | uVar15 << 8;
            }
            uVar34 = (ulong)(uVar21 + (int)uVar22 + uVar16);
            uVar2 = *(ushort *)((long)pvVar23 + uVar34 * 2);
            uVar19 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar24 = (int)uVar22 * 2;
            uVar15 = uVar32 - uVar19;
            if (uVar32 < uVar19) {
              sVar11 = (short)(0x800 - uVar2 >> 5);
              uVar16 = uVar16 ^ uVar21;
              uVar15 = uVar32;
              uVar31 = uVar19;
            }
            else {
              uVar31 = uVar31 - uVar19;
              sVar11 = -(uVar2 >> 5);
              uVar24 = uVar24 | 1;
            }
            uVar22 = (ulong)uVar24;
            *(ushort *)((long)pvVar23 + uVar34 * 2) = sVar11 + uVar2;
            local_f0 = (ulong)((uint)local_f0 * 2);
switchD_0017835c_caseD_e:
            uVar21 = uVar16 & (uint)local_f0;
            uVar32 = uVar15;
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0xe;
                local_f8 = in_size;
                goto LAB_0017b237;
              }
              uVar31 = uVar31 << 8;
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar32 = (uint)*pbVar1 | uVar15 << 8;
            }
            uVar34 = (ulong)(uVar16 + (int)uVar22 + uVar21);
            uVar2 = *(ushort *)((long)pvVar23 + uVar34 * 2);
            uVar19 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar24 = (int)uVar22 * 2;
            uVar15 = uVar32 - uVar19;
            if (uVar32 < uVar19) {
              sVar11 = (short)(0x800 - uVar2 >> 5);
              uVar21 = uVar21 ^ uVar16;
              uVar15 = uVar32;
              uVar31 = uVar19;
            }
            else {
              uVar31 = uVar31 - uVar19;
              sVar11 = -(uVar2 >> 5);
              uVar24 = uVar24 | 1;
            }
            uVar22 = (ulong)uVar24;
            *(ushort *)((long)pvVar23 + uVar34 * 2) = sVar11 + uVar2;
            local_f0 = (ulong)((uint)local_f0 * 2);
switchD_0017835c_caseD_f:
            uVar16 = uVar21 & (uint)local_f0;
            uVar32 = uVar15;
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0xf;
                local_f8 = in_size;
                uVar16 = uVar21;
                goto LAB_0017b237;
              }
              uVar31 = uVar31 << 8;
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar32 = (uint)*pbVar1 | uVar15 << 8;
            }
            uVar34 = (ulong)(uVar21 + (int)uVar22 + uVar16);
            uVar2 = *(ushort *)((long)pvVar23 + uVar34 * 2);
            uVar19 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar24 = (int)uVar22 * 2;
            uVar15 = uVar32 - uVar19;
            if (uVar32 < uVar19) {
              sVar11 = (short)(0x800 - uVar2 >> 5);
              uVar16 = uVar16 ^ uVar21;
              uVar15 = uVar32;
              uVar31 = uVar19;
            }
            else {
              uVar31 = uVar31 - uVar19;
              sVar11 = -(uVar2 >> 5);
              uVar24 = uVar24 | 1;
            }
            uVar22 = (ulong)uVar24;
            *(ushort *)((long)pvVar23 + uVar34 * 2) = sVar11 + uVar2;
            local_f0 = (ulong)((uint)local_f0 * 2);
switchD_0017835c_caseD_10:
            uVar21 = uVar16 & (uint)local_f0;
            uVar32 = uVar15;
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x10;
                local_f8 = in_size;
                goto LAB_0017b237;
              }
              uVar31 = uVar31 << 8;
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar32 = (uint)*pbVar1 | uVar15 << 8;
            }
            uVar34 = (ulong)(uVar16 + (int)uVar22 + uVar21);
            uVar2 = *(ushort *)((long)pvVar23 + uVar34 * 2);
            uVar19 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar24 = (int)uVar22 * 2;
            uVar15 = uVar32 - uVar19;
            if (uVar32 < uVar19) {
              sVar11 = (short)(0x800 - uVar2 >> 5);
              uVar21 = uVar21 ^ uVar16;
              uVar15 = uVar32;
              uVar31 = uVar19;
            }
            else {
              uVar31 = uVar31 - uVar19;
              sVar11 = -(uVar2 >> 5);
              uVar24 = uVar24 | 1;
            }
            uVar22 = (ulong)uVar24;
            *(ushort *)((long)pvVar23 + uVar34 * 2) = sVar11 + uVar2;
            local_f0 = (ulong)((uint)local_f0 * 2);
switchD_0017835c_caseD_11:
            uVar16 = uVar21 & (uint)local_f0;
            uVar32 = uVar15;
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x11;
                local_f8 = in_size;
                uVar16 = uVar21;
                goto LAB_0017b237;
              }
              uVar31 = uVar31 << 8;
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar32 = (uint)*pbVar1 | uVar15 << 8;
            }
            uVar18 = (ulong)(uVar21 + (int)uVar22 + uVar16);
            uVar2 = *(ushort *)((long)pvVar23 + uVar18 * 2);
            uVar19 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar24 = (int)uVar22 * 2;
            uVar34 = (ulong)uVar24;
            uVar15 = uVar32 - uVar19;
            if (uVar32 < uVar19) {
              *(ushort *)((long)pvVar23 + uVar18 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar16 = uVar16 ^ uVar21;
              uVar15 = uVar32;
              uVar31 = uVar19;
            }
            else {
              uVar31 = uVar31 - uVar19;
              *(ushort *)((long)pvVar23 + uVar18 * 2) = uVar2 - (uVar2 >> 5);
              uVar34 = (ulong)(uVar24 | 1);
            }
          }
          lVar28 = lzma_decode::next_state[lVar28];
switchD_0017835c_caseD_12:
          uVar22 = uVar34;
          if (sVar26 == sVar20) {
            *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x12;
            sVar26 = sVar20;
            goto LAB_0017b237;
          }
          puVar8[sVar26] = (uint8_t)uVar34;
          uVar18 = uVar33;
LAB_0017acd2:
          sVar26 = sVar26 + 1;
          if (local_a8 < sVar26) {
            local_a8 = sVar26;
          }
        }
        else {
          uVar31 = uVar21 - uVar31;
          *puVar25 = uVar2 - (uVar2 >> 5);
          uVar18 = uVar33;
switchD_0017835c_caseD_13:
          uVar24 = local_c8;
          local_c8 = local_c4;
          uVar21 = (uint)local_f0;
          uVar19 = uVar31;
          uVar15 = uVar32;
          if (uVar31 < 0x1000000) {
            if (local_f8 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x13;
              local_f8 = in_size;
              local_c8 = uVar24;
              goto LAB_001783b6;
            }
            pbVar1 = in + local_f8;
            local_f8 = local_f8 + 1;
            uVar19 = uVar31 << 8;
            uVar15 = (uint)*pbVar1 | uVar32 << 8;
          }
          uVar34 = (ulong)lVar28;
          uVar2 = *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6180);
          uVar31 = (uVar19 >> 0xb) * (uint)uVar2;
          uVar32 = uVar15 - uVar31;
          uVar33 = uVar18;
          if (uVar15 < uVar31) {
            *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6180) = (short)(0x800 - uVar2 >> 5) + uVar2
            ;
            lVar28 = (uint)(STATE_SHORTREP_LIT < lVar28) * 3 + STATE_LIT_MATCH;
            uVar22 = 1;
            local_c4 = (uint)uVar18;
            local_9c = uVar24;
switchD_0017835c_caseD_14:
            uVar21 = uVar31;
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x14;
                local_f8 = in_size;
                goto LAB_0017b237;
              }
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar15 = (uint)*pbVar1 | uVar15 << 8;
              uVar21 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)coder_ptr + 0x6664);
            uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
            uVar32 = uVar15 - uVar31;
            if (uVar15 < uVar31) {
              *(ushort *)((long)coder_ptr + 0x6664) = (short)(0x800 - uVar2 >> 5) + uVar2;
switchD_0017835c_caseD_15:
              uVar21 = uVar31;
              if (uVar31 < 0x1000000) {
                if (local_f8 == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x15;
                  local_f8 = in_size;
                  goto LAB_0017b237;
                }
                pbVar1 = in + local_f8;
                local_f8 = local_f8 + 1;
                uVar15 = (uint)*pbVar1 | uVar15 << 8;
                uVar21 = uVar31 << 8;
              }
              puVar25 = (ushort *)((long)coder_ptr + uVar22 * 2 + local_b8 * 0x10 + 0x6668);
              uVar2 = *puVar25;
              uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
              uVar24 = (int)uVar22 * 2;
              uVar22 = (ulong)uVar24;
              uVar32 = uVar15 - uVar31;
              if (uVar15 < uVar31) {
                *puVar25 = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar32 = uVar15;
              }
              else {
                uVar31 = uVar21 - uVar31;
                *puVar25 = uVar2 - (uVar2 >> 5);
                uVar22 = (ulong)(uVar24 | 1);
              }
switchD_0017835c_caseD_16:
              uVar15 = uVar31;
              if (uVar31 < 0x1000000) {
                if (local_f8 == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x16;
                  local_f8 = in_size;
                  uVar15 = uVar32;
                  goto LAB_0017b237;
                }
                pbVar1 = in + local_f8;
                local_f8 = local_f8 + 1;
                uVar32 = (uint)*pbVar1 | uVar32 << 8;
                uVar15 = uVar31 << 8;
              }
              puVar25 = (ushort *)((long)coder_ptr + uVar22 * 2 + local_b8 * 0x10 + 0x6668);
              uVar2 = *puVar25;
              uVar31 = (uVar15 >> 0xb) * (uint)uVar2;
              uVar21 = (int)uVar22 * 2;
              uVar22 = (ulong)uVar21;
              uVar24 = uVar32 - uVar31;
              if (uVar32 < uVar31) {
                *puVar25 = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar24 = uVar32;
              }
              else {
                uVar31 = uVar15 - uVar31;
                *puVar25 = uVar2 - (uVar2 >> 5);
                uVar22 = (ulong)(uVar21 | 1);
              }
switchD_0017835c_caseD_17:
              if (uVar31 < 0x1000000) {
                if (local_f8 == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x17;
                  local_f8 = in_size;
                  uVar15 = uVar24;
                  goto LAB_0017b237;
                }
                uVar31 = uVar31 << 8;
                pbVar1 = in + local_f8;
                local_f8 = local_f8 + 1;
                uVar24 = (uint)*pbVar1 | uVar24 << 8;
              }
              puVar25 = (ushort *)((long)coder_ptr + uVar22 * 2 + local_b8 * 0x10 + 0x6668);
              uVar2 = *puVar25;
              uVar32 = (uVar31 >> 0xb) * (uint)uVar2;
              uVar21 = (int)uVar22 * 2;
              uVar15 = uVar24 - uVar32;
              if (uVar24 < uVar32) {
                sVar11 = (short)(0x800 - uVar2 >> 5);
                uVar15 = uVar24;
              }
              else {
                uVar32 = uVar31 - uVar32;
                sVar11 = -(uVar2 >> 5);
                uVar21 = uVar21 | 1;
              }
              *puVar25 = sVar11 + uVar2;
              local_f0 = (ulong)(uVar21 - 6);
              uVar31 = uVar32;
            }
            else {
              uVar31 = uVar21 - uVar31;
              *(ushort *)((long)coder_ptr + 0x6664) = uVar2 - (uVar2 >> 5);
switchD_0017835c_caseD_18:
              uVar21 = uVar31;
              uVar15 = uVar32;
              if (uVar31 < 0x1000000) {
                if (local_f8 == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x18;
                  local_f8 = in_size;
                  goto LAB_0017b237;
                }
                pbVar1 = in + local_f8;
                local_f8 = local_f8 + 1;
                uVar21 = uVar31 << 8;
                uVar15 = (uint)*pbVar1 | uVar32 << 8;
              }
              uVar2 = *(ushort *)((long)coder_ptr + 0x6666);
              uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
              uVar32 = uVar15 - uVar31;
              if (uVar15 < uVar31) {
                *(ushort *)((long)coder_ptr + 0x6666) = (short)(0x800 - uVar2 >> 5) + uVar2;
switchD_0017835c_caseD_19:
                uVar21 = uVar31;
                if (uVar31 < 0x1000000) {
                  if (local_f8 == in_size) {
                    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x19;
                    local_f8 = in_size;
                    goto LAB_0017b237;
                  }
                  pbVar1 = in + local_f8;
                  local_f8 = local_f8 + 1;
                  uVar15 = (uint)*pbVar1 | uVar15 << 8;
                  uVar21 = uVar31 << 8;
                }
                puVar25 = (ushort *)((long)coder_ptr + uVar22 * 2 + local_b8 * 0x10 + 0x6768);
                uVar2 = *puVar25;
                uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
                uVar24 = (int)uVar22 * 2;
                uVar22 = (ulong)uVar24;
                uVar32 = uVar15 - uVar31;
                if (uVar15 < uVar31) {
                  *puVar25 = (short)(0x800 - uVar2 >> 5) + uVar2;
                  uVar32 = uVar15;
                }
                else {
                  uVar31 = uVar21 - uVar31;
                  *puVar25 = uVar2 - (uVar2 >> 5);
                  uVar22 = (ulong)(uVar24 | 1);
                }
switchD_0017835c_caseD_1a:
                uVar15 = uVar31;
                if (uVar31 < 0x1000000) {
                  if (local_f8 == in_size) {
                    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x1a;
                    local_f8 = in_size;
                    uVar15 = uVar32;
                    goto LAB_0017b237;
                  }
                  pbVar1 = in + local_f8;
                  local_f8 = local_f8 + 1;
                  uVar32 = (uint)*pbVar1 | uVar32 << 8;
                  uVar15 = uVar31 << 8;
                }
                puVar25 = (ushort *)((long)coder_ptr + uVar22 * 2 + local_b8 * 0x10 + 0x6768);
                uVar2 = *puVar25;
                uVar31 = (uVar15 >> 0xb) * (uint)uVar2;
                uVar21 = (int)uVar22 * 2;
                uVar22 = (ulong)uVar21;
                uVar24 = uVar32 - uVar31;
                if (uVar32 < uVar31) {
                  *puVar25 = (short)(0x800 - uVar2 >> 5) + uVar2;
                  uVar24 = uVar32;
                }
                else {
                  uVar31 = uVar15 - uVar31;
                  *puVar25 = uVar2 - (uVar2 >> 5);
                  uVar22 = (ulong)(uVar21 | 1);
                }
switchD_0017835c_caseD_1b:
                if (uVar31 < 0x1000000) {
                  if (local_f8 == in_size) {
                    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x1b;
                    local_f8 = in_size;
                    uVar15 = uVar24;
                    goto LAB_0017b237;
                  }
                  uVar31 = uVar31 << 8;
                  pbVar1 = in + local_f8;
                  local_f8 = local_f8 + 1;
                  uVar24 = (uint)*pbVar1 | uVar24 << 8;
                }
                puVar25 = (ushort *)((long)coder_ptr + uVar22 * 2 + local_b8 * 0x10 + 0x6768);
                uVar2 = *puVar25;
                uVar32 = (uVar31 >> 0xb) * (uint)uVar2;
                uVar21 = (int)uVar22 * 2;
                uVar15 = uVar24 - uVar32;
                if (uVar24 < uVar32) {
                  sVar11 = (short)(0x800 - uVar2 >> 5);
                  uVar15 = uVar24;
                  uVar31 = uVar32;
                }
                else {
                  uVar31 = uVar31 - uVar32;
                  sVar11 = -(uVar2 >> 5);
                  uVar21 = uVar21 | 1;
                }
                *puVar25 = sVar11 + uVar2;
                local_f0 = (ulong)(uVar21 + 2);
              }
              else {
                uVar31 = uVar21 - uVar31;
                *(ushort *)((long)coder_ptr + 0x6666) = uVar2 - (uVar2 >> 5);
                uVar34 = uVar22;
switchD_0017835c_caseD_1c:
                uVar21 = uVar31;
                if (uVar31 < 0x1000000) {
                  if (local_f8 == in_size) {
                    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x1c;
                    local_f8 = in_size;
                    uVar22 = uVar34;
                    uVar15 = uVar32;
                    goto LAB_0017b237;
                  }
                  pbVar1 = in + local_f8;
                  local_f8 = local_f8 + 1;
                  uVar32 = (uint)*pbVar1 | uVar32 << 8;
                  uVar21 = uVar31 << 8;
                }
                uVar2 = *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6868);
                uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
                uVar24 = (int)uVar34 * 2;
                uVar22 = (ulong)uVar24;
                uVar15 = uVar32 - uVar31;
                if (uVar32 < uVar31) {
                  *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6868) =
                       (short)(0x800 - uVar2 >> 5) + uVar2;
                  uVar15 = uVar32;
                }
                else {
                  uVar31 = uVar21 - uVar31;
                  *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6868) = uVar2 - (uVar2 >> 5);
                  uVar22 = (ulong)(uVar24 | 1);
                }
switchD_0017835c_caseD_1d:
                uVar21 = uVar31;
                if (uVar31 < 0x1000000) {
                  if (local_f8 == in_size) {
                    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x1d;
                    local_f8 = in_size;
                    goto LAB_0017b237;
                  }
                  pbVar1 = in + local_f8;
                  local_f8 = local_f8 + 1;
                  uVar15 = (uint)*pbVar1 | uVar15 << 8;
                  uVar21 = uVar31 << 8;
                }
                uVar2 = *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6868);
                uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
                uVar24 = (int)uVar22 * 2;
                uVar34 = (ulong)uVar24;
                uVar32 = uVar15 - uVar31;
                if (uVar15 < uVar31) {
                  *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6868) =
                       (short)(0x800 - uVar2 >> 5) + uVar2;
                  uVar32 = uVar15;
                }
                else {
                  uVar31 = uVar21 - uVar31;
                  *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6868) = uVar2 - (uVar2 >> 5);
                  uVar34 = (ulong)(uVar24 | 1);
                }
switchD_0017835c_caseD_1e:
                uVar21 = uVar31;
                if (uVar31 < 0x1000000) {
                  if (local_f8 == in_size) {
                    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x1e;
                    local_f8 = in_size;
                    uVar22 = uVar34;
                    uVar15 = uVar32;
                    goto LAB_0017b237;
                  }
                  pbVar1 = in + local_f8;
                  local_f8 = local_f8 + 1;
                  uVar32 = (uint)*pbVar1 | uVar32 << 8;
                  uVar21 = uVar31 << 8;
                }
                uVar2 = *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6868);
                uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
                uVar24 = (int)uVar34 * 2;
                uVar22 = (ulong)uVar24;
                uVar15 = uVar32 - uVar31;
                if (uVar32 < uVar31) {
                  *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6868) =
                       (short)(0x800 - uVar2 >> 5) + uVar2;
                  uVar15 = uVar32;
                }
                else {
                  uVar31 = uVar21 - uVar31;
                  *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6868) = uVar2 - (uVar2 >> 5);
                  uVar22 = (ulong)(uVar24 | 1);
                }
switchD_0017835c_caseD_1f:
                uVar21 = uVar31;
                if (uVar31 < 0x1000000) {
                  if (local_f8 == in_size) {
                    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x1f;
                    local_f8 = in_size;
                    goto LAB_0017b237;
                  }
                  pbVar1 = in + local_f8;
                  local_f8 = local_f8 + 1;
                  uVar15 = (uint)*pbVar1 | uVar15 << 8;
                  uVar21 = uVar31 << 8;
                }
                uVar2 = *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6868);
                uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
                uVar24 = (int)uVar22 * 2;
                uVar34 = (ulong)uVar24;
                uVar32 = uVar15 - uVar31;
                if (uVar15 < uVar31) {
                  *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6868) =
                       (short)(0x800 - uVar2 >> 5) + uVar2;
                  uVar32 = uVar15;
                }
                else {
                  uVar31 = uVar21 - uVar31;
                  *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6868) = uVar2 - (uVar2 >> 5);
                  uVar34 = (ulong)(uVar24 | 1);
                }
switchD_0017835c_caseD_20:
                uVar21 = uVar31;
                if (uVar31 < 0x1000000) {
                  if (local_f8 == in_size) {
                    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x20;
                    local_f8 = in_size;
                    uVar22 = uVar34;
                    uVar15 = uVar32;
                    goto LAB_0017b237;
                  }
                  pbVar1 = in + local_f8;
                  local_f8 = local_f8 + 1;
                  uVar32 = (uint)*pbVar1 | uVar32 << 8;
                  uVar21 = uVar31 << 8;
                }
                uVar2 = *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6868);
                uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
                uVar24 = (int)uVar34 * 2;
                uVar22 = (ulong)uVar24;
                uVar15 = uVar32 - uVar31;
                if (uVar32 < uVar31) {
                  *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6868) =
                       (short)(0x800 - uVar2 >> 5) + uVar2;
                  uVar15 = uVar32;
                }
                else {
                  uVar31 = uVar21 - uVar31;
                  *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6868) = uVar2 - (uVar2 >> 5);
                  uVar22 = (ulong)(uVar24 | 1);
                }
switchD_0017835c_caseD_21:
                uVar21 = uVar31;
                if (uVar31 < 0x1000000) {
                  if (local_f8 == in_size) {
                    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x21;
                    local_f8 = in_size;
                    goto LAB_0017b237;
                  }
                  pbVar1 = in + local_f8;
                  local_f8 = local_f8 + 1;
                  uVar15 = (uint)*pbVar1 | uVar15 << 8;
                  uVar21 = uVar31 << 8;
                }
                uVar2 = *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6868);
                uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
                uVar24 = (int)uVar22 * 2;
                uVar34 = (ulong)uVar24;
                uVar32 = uVar15 - uVar31;
                if (uVar15 < uVar31) {
                  *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6868) =
                       (short)(0x800 - uVar2 >> 5) + uVar2;
                  uVar32 = uVar15;
                }
                else {
                  uVar31 = uVar21 - uVar31;
                  *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6868) = uVar2 - (uVar2 >> 5);
                  uVar34 = (ulong)(uVar24 | 1);
                }
switchD_0017835c_caseD_22:
                uVar15 = uVar31;
                if (uVar31 < 0x1000000) {
                  if (local_f8 == in_size) {
                    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x22;
                    local_f8 = in_size;
                    uVar22 = uVar34;
                    uVar15 = uVar32;
                    goto LAB_0017b237;
                  }
                  pbVar1 = in + local_f8;
                  local_f8 = local_f8 + 1;
                  uVar32 = (uint)*pbVar1 | uVar32 << 8;
                  uVar15 = uVar31 << 8;
                }
                uVar2 = *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6868);
                uVar31 = (uVar15 >> 0xb) * (uint)uVar2;
                uVar21 = (int)uVar34 * 2;
                uVar22 = (ulong)uVar21;
                uVar24 = uVar32 - uVar31;
                if (uVar32 < uVar31) {
                  *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6868) =
                       (short)(0x800 - uVar2 >> 5) + uVar2;
                  uVar24 = uVar32;
                }
                else {
                  uVar31 = uVar15 - uVar31;
                  *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6868) = uVar2 - (uVar2 >> 5);
                  uVar22 = (ulong)(uVar21 | 1);
                }
switchD_0017835c_caseD_23:
                if (uVar31 < 0x1000000) {
                  if (local_f8 == in_size) {
                    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x23;
                    local_f8 = in_size;
                    uVar15 = uVar24;
                    goto LAB_0017b237;
                  }
                  uVar31 = uVar31 << 8;
                  pbVar1 = in + local_f8;
                  local_f8 = local_f8 + 1;
                  uVar24 = (uint)*pbVar1 | uVar24 << 8;
                }
                uVar2 = *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6868);
                uVar32 = (uVar31 >> 0xb) * (uint)uVar2;
                uVar21 = (int)uVar22 * 2;
                uVar15 = uVar24 - uVar32;
                if (uVar24 < uVar32) {
                  sVar11 = (short)(0x800 - uVar2 >> 5);
                  uVar15 = uVar24;
                  uVar31 = uVar32;
                }
                else {
                  uVar31 = uVar31 - uVar32;
                  sVar11 = -(uVar2 >> 5);
                  uVar21 = uVar21 | 1;
                }
                *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6868) = sVar11 + uVar2;
                local_f0 = (ulong)(uVar21 - 0xee);
              }
            }
            uVar22 = 3;
            if ((uint)local_f0 < 6) {
              uVar22 = (ulong)((uint)local_f0 - 2);
            }
            pvVar23 = (void *)((long)coder_ptr + uVar22 * 0x80 + 0x6360);
            uVar34 = 1;
switchD_0017835c_caseD_24:
            uVar21 = uVar31;
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x24;
                local_f8 = in_size;
                uVar22 = uVar34;
                goto LAB_0017b237;
              }
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar15 = (uint)*pbVar1 | uVar15 << 8;
              uVar21 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)pvVar23 + uVar34 * 2);
            uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
            uVar24 = (int)uVar34 * 2;
            uVar22 = (ulong)uVar24;
            uVar32 = uVar15 - uVar31;
            if (uVar15 < uVar31) {
              *(ushort *)((long)pvVar23 + uVar34 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar32 = uVar15;
            }
            else {
              uVar31 = uVar21 - uVar31;
              *(ushort *)((long)pvVar23 + uVar34 * 2) = uVar2 - (uVar2 >> 5);
              uVar22 = (ulong)(uVar24 | 1);
            }
switchD_0017835c_caseD_25:
            uVar21 = uVar31;
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x25;
                local_f8 = in_size;
                uVar15 = uVar32;
                goto LAB_0017b237;
              }
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar32 = (uint)*pbVar1 | uVar32 << 8;
              uVar21 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)pvVar23 + uVar22 * 2);
            uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
            uVar24 = (int)uVar22 * 2;
            uVar34 = (ulong)uVar24;
            uVar15 = uVar32 - uVar31;
            if (uVar32 < uVar31) {
              *(ushort *)((long)pvVar23 + uVar22 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar15 = uVar32;
            }
            else {
              uVar31 = uVar21 - uVar31;
              *(ushort *)((long)pvVar23 + uVar22 * 2) = uVar2 - (uVar2 >> 5);
              uVar34 = (ulong)(uVar24 | 1);
            }
switchD_0017835c_caseD_26:
            uVar21 = uVar31;
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x26;
                local_f8 = in_size;
                uVar22 = uVar34;
                goto LAB_0017b237;
              }
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar15 = (uint)*pbVar1 | uVar15 << 8;
              uVar21 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)pvVar23 + uVar34 * 2);
            uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
            uVar24 = (int)uVar34 * 2;
            uVar22 = (ulong)uVar24;
            uVar32 = uVar15 - uVar31;
            if (uVar15 < uVar31) {
              *(ushort *)((long)pvVar23 + uVar34 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar32 = uVar15;
            }
            else {
              uVar31 = uVar21 - uVar31;
              *(ushort *)((long)pvVar23 + uVar34 * 2) = uVar2 - (uVar2 >> 5);
              uVar22 = (ulong)(uVar24 | 1);
            }
switchD_0017835c_caseD_27:
            uVar21 = uVar31;
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x27;
                local_f8 = in_size;
                uVar15 = uVar32;
                goto LAB_0017b237;
              }
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar32 = (uint)*pbVar1 | uVar32 << 8;
              uVar21 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)pvVar23 + uVar22 * 2);
            uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
            uVar24 = (int)uVar22 * 2;
            uVar34 = (ulong)uVar24;
            uVar15 = uVar32 - uVar31;
            if (uVar32 < uVar31) {
              *(ushort *)((long)pvVar23 + uVar22 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar15 = uVar32;
            }
            else {
              uVar31 = uVar21 - uVar31;
              *(ushort *)((long)pvVar23 + uVar22 * 2) = uVar2 - (uVar2 >> 5);
              uVar34 = (ulong)(uVar24 | 1);
            }
switchD_0017835c_caseD_28:
            uVar21 = uVar31;
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x28;
                local_f8 = in_size;
                uVar22 = uVar34;
                goto LAB_0017b237;
              }
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar15 = (uint)*pbVar1 | uVar15 << 8;
              uVar21 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)pvVar23 + uVar34 * 2);
            uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
            uVar24 = (int)uVar34 * 2;
            uVar22 = (ulong)uVar24;
            uVar32 = uVar15 - uVar31;
            if (uVar15 < uVar31) {
              *(ushort *)((long)pvVar23 + uVar34 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar32 = uVar15;
            }
            else {
              uVar31 = uVar21 - uVar31;
              *(ushort *)((long)pvVar23 + uVar34 * 2) = uVar2 - (uVar2 >> 5);
              uVar22 = (ulong)(uVar24 | 1);
            }
switchD_0017835c_caseD_29:
            uVar21 = uVar31;
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x29;
                local_f8 = in_size;
                uVar15 = uVar32;
                goto LAB_0017b237;
              }
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar32 = (uint)*pbVar1 | uVar32 << 8;
              uVar21 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)pvVar23 + uVar22 * 2);
            uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
            uVar24 = (int)uVar22 * 2;
            uVar15 = uVar32 - uVar31;
            if (uVar32 < uVar31) {
              sVar11 = (short)(0x800 - uVar2 >> 5);
              uVar15 = uVar32;
            }
            else {
              uVar31 = uVar21 - uVar31;
              sVar11 = -(uVar2 >> 5);
              uVar24 = uVar24 | 1;
            }
            *(ushort *)((long)pvVar23 + uVar22 * 2) = sVar11 + uVar2;
            uVar21 = uVar24 - 0x40;
            uVar18 = (ulong)uVar21;
            if (0x3f < uVar21) {
              __assert_fail("symbol <= 63",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                            ,0x218,
                            "lzma_ret lzma_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                           );
            }
            uVar34 = uVar18;
            if (uVar21 < 4) {
switchD_0017a312_default:
              uVar33 = uVar18;
              uVar22 = uVar34;
              if (uVar18 < local_a8) goto LAB_0017b035;
            }
            else {
              uVar30 = (uVar21 >> 1) - 1;
              uVar32 = uVar24 & 1 | 2;
              uVar33 = (ulong)uVar32;
              if (uVar21 < 0xe) {
                if (5 < uVar30) {
                  __assert_fail("limit <= 5",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                                ,0x227,
                                "lzma_ret lzma_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                               );
                }
                uVar32 = uVar32 << ((byte)uVar30 & 0x1f);
                uVar33 = (ulong)uVar32;
                if ((int)(uVar32 - uVar24) < -0x40) {
                  __assert_fail("(int32_t)(rep0 - symbol - 1) >= -1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                                ,0x231,
                                "lzma_ret lzma_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                               );
                }
                if (0x13 < (int)(uVar32 - uVar24)) {
                  __assert_fail("(int32_t)(rep0 - symbol - 1) <= 82",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                                ,0x233,
                                "lzma_ret lzma_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                               );
                }
                pvVar23 = (void *)((long)coder_ptr + uVar18 * -2 + (ulong)uVar32 * 2 + 0x655e);
                uVar16 = 0;
                uVar22 = 1;
switchD_0017835c_caseD_2a:
                uVar18 = uVar33;
                uVar34 = uVar22;
                uVar32 = uVar15;
                switch(uVar30) {
                case 1:
                  goto LAB_0017af8e;
                case 2:
                  goto LAB_0017aee2;
                case 3:
                  break;
                case 4:
LAB_0017ad99:
                  if (uVar31 < 0x1000000) {
                    if (local_f8 == in_size) {
                      *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2a;
                      uVar30 = 4;
                      uVar32 = uVar15;
                      goto LAB_0017ba5f;
                    }
                    uVar31 = uVar31 << 8;
                    pbVar1 = in + local_f8;
                    local_f8 = local_f8 + 1;
                    uVar15 = (uint)*pbVar1 | uVar15 << 8;
                  }
                  uVar2 = *(ushort *)((long)pvVar23 + uVar22 * 2);
                  uVar21 = (uVar31 >> 0xb) * (uint)uVar2;
                  uVar30 = (int)uVar22 * 2;
                  uVar32 = uVar15 - uVar21;
                  if (uVar15 < uVar21) {
                    sVar11 = (short)(0x800 - uVar2 >> 5);
                    uVar32 = uVar15;
                    uVar31 = uVar21;
                  }
                  else {
                    uVar31 = uVar31 - uVar21;
                    sVar11 = -(uVar2 >> 5);
                    uVar30 = uVar30 | 1;
                    uVar33 = (ulong)(uint)((1 << ((byte)uVar16 & 0x1f)) + (int)uVar33);
                  }
                  *(ushort *)((long)pvVar23 + uVar22 * 2) = sVar11 + uVar2;
                  uVar16 = uVar16 + 1;
                  uVar22 = (ulong)uVar30;
                  break;
                case 5:
                  if (uVar16 != 0) {
                    __assert_fail("offset == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                                  ,0x242,
                                  "lzma_ret lzma_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                                 );
                  }
                  uVar30 = uVar15;
                  uVar16 = uVar31;
                  if (0xffffff < uVar31) {
LAB_0017ad49:
                    uVar2 = *(ushort *)((long)pvVar23 + uVar22 * 2);
                    uVar31 = (uVar16 >> 0xb) * (uint)uVar2;
                    uVar21 = (int)uVar22 * 2;
                    uVar15 = uVar30 - uVar31;
                    if (uVar30 < uVar31) {
                      *(ushort *)((long)pvVar23 + uVar22 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
                      uVar16 = 1;
                      uVar22 = (ulong)uVar21;
                      uVar15 = uVar30;
                    }
                    else {
                      uVar31 = uVar16 - uVar31;
                      *(ushort *)((long)pvVar23 + uVar22 * 2) = uVar2 - (uVar2 >> 5);
                      uVar22 = (ulong)(uVar21 | 1);
                      uVar33 = (ulong)((int)uVar33 + 1);
                      uVar16 = 1;
                    }
                    goto LAB_0017ad99;
                  }
                  if (local_f8 != in_size) {
                    pbVar1 = in + local_f8;
                    local_f8 = local_f8 + 1;
                    uVar30 = (uint)*pbVar1 | uVar15 << 8;
                    uVar16 = uVar31 << 8;
                    goto LAB_0017ad49;
                  }
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2a;
                  uVar16 = 0;
                  uVar30 = 5;
                  goto LAB_0017ba5f;
                default:
                  goto switchD_0017a312_default;
                }
                if (0xffffff < uVar31) {
LAB_0017ae67:
                  uVar2 = *(ushort *)((long)pvVar23 + uVar22 * 2);
                  uVar21 = (uVar31 >> 0xb) * (uint)uVar2;
                  uVar15 = (int)uVar22 * 2;
                  uVar30 = uVar32 - uVar21;
                  if (uVar32 < uVar21) {
                    sVar11 = (short)(0x800 - uVar2 >> 5);
                    uVar30 = uVar32;
                    uVar31 = uVar21;
                  }
                  else {
                    uVar31 = uVar31 - uVar21;
                    sVar11 = -(uVar2 >> 5);
                    uVar15 = uVar15 | 1;
                    uVar33 = (ulong)(uint)((1 << ((byte)uVar16 & 0x1f)) + (int)uVar33);
                  }
                  *(ushort *)((long)pvVar23 + uVar22 * 2) = sVar11 + uVar2;
                  uVar16 = uVar16 + 1;
                  uVar34 = (ulong)uVar15;
                  uVar32 = uVar30;
LAB_0017aee2:
                  if (uVar31 < 0x1000000) {
                    if (local_f8 == in_size) {
                      *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2a;
                      uVar30 = 2;
                      uVar22 = uVar34;
                      goto LAB_0017ba5f;
                    }
                    uVar31 = uVar31 << 8;
                    pbVar1 = in + local_f8;
                    local_f8 = local_f8 + 1;
                    uVar32 = (uint)*pbVar1 | uVar32 << 8;
                  }
                  uVar2 = *(ushort *)((long)pvVar23 + uVar34 * 2);
                  uVar21 = (uVar31 >> 0xb) * (uint)uVar2;
                  uVar30 = (int)uVar34 * 2;
                  uVar15 = uVar32 - uVar21;
                  if (uVar32 < uVar21) {
                    sVar11 = (short)(0x800 - uVar2 >> 5);
                    uVar15 = uVar32;
                    uVar31 = uVar21;
                  }
                  else {
                    uVar31 = uVar31 - uVar21;
                    sVar11 = -(uVar2 >> 5);
                    uVar30 = uVar30 | 1;
                    uVar33 = (ulong)(uint)((1 << ((byte)uVar16 & 0x1f)) + (int)uVar33);
                  }
                  uVar22 = (ulong)uVar30;
                  *(ushort *)((long)pvVar23 + uVar34 * 2) = sVar11 + uVar2;
                  uVar16 = uVar16 + 1;
                  uVar18 = uVar33;
LAB_0017af8e:
                  uVar30 = uVar31;
                  if (uVar31 < 0x1000000) {
                    if (local_f8 == in_size) {
                      *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2a;
                      bVar13 = false;
                      bVar12 = true;
                      uVar30 = 1;
                      lVar29 = LZMA_OK;
                      uVar21 = (uint)local_f0;
                      local_f8 = in_size;
                      break;
                    }
                    pbVar1 = in + local_f8;
                    local_f8 = local_f8 + 1;
                    uVar15 = (uint)*pbVar1 | uVar15 << 8;
                    uVar30 = uVar31 << 8;
                  }
                  uVar2 = *(ushort *)((long)pvVar23 + uVar22 * 2);
                  uVar31 = (uVar30 >> 0xb) * (uint)uVar2;
                  uVar21 = uVar15 - uVar31;
                  uVar34 = uVar22;
                  if (uVar15 < uVar31) {
                    *(ushort *)((long)pvVar23 + uVar22 * 2) = (short)(0x800 - uVar2 >> 5) + uVar2;
                    uVar30 = 1;
                  }
                  else {
                    uVar31 = uVar30 - uVar31;
                    *(ushort *)((long)pvVar23 + uVar22 * 2) = uVar2 - (uVar2 >> 5);
                    uVar30 = 1;
                    uVar18 = (ulong)(uint)((1 << ((byte)uVar16 & 0x1f)) + (int)uVar18);
                    uVar15 = uVar21;
                  }
                  goto switchD_0017a312_default;
                }
                if (local_f8 != in_size) {
                  uVar31 = uVar31 << 8;
                  pbVar1 = in + local_f8;
                  local_f8 = local_f8 + 1;
                  uVar32 = (uint)*pbVar1 | uVar32 << 8;
                  goto LAB_0017ae67;
                }
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2a;
                uVar30 = 3;
LAB_0017ba5f:
                bVar13 = false;
                lVar29 = LZMA_OK;
                bVar12 = true;
                local_f8 = in_size;
                uVar18 = uVar33;
                goto LAB_0017b246;
              }
              if (uVar30 < 6) {
                __assert_fail("limit >= 6",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                              ,0x26b,
                              "lzma_ret lzma_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                             );
              }
              uVar30 = (uVar21 >> 1) - 5;
              uVar22 = uVar18;
switchD_0017835c_caseD_2b:
              do {
                if (uVar31 < 0x1000000) {
                  if (local_f8 == in_size) {
                    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2b;
                    local_f8 = in_size;
                    goto LAB_0017b237;
                  }
                  uVar31 = uVar31 << 8;
                  pbVar1 = in + local_f8;
                  local_f8 = local_f8 + 1;
                  uVar15 = uVar15 << 8 | (uint)*pbVar1;
                }
                uVar31 = uVar31 >> 1;
                uVar21 = (int)(uVar15 - uVar31) >> 0x1f;
                uVar32 = uVar21 + (int)uVar33 * 2 + 1;
                uVar33 = (ulong)uVar32;
                uVar15 = (uVar21 & uVar31) + (uVar15 - uVar31);
                uVar30 = uVar30 - 1;
              } while (uVar30 != 0);
              uVar33 = (ulong)(uVar32 * 0x10);
              uVar30 = 0;
              uVar22 = 1;
switchD_0017835c_caseD_2c:
              uVar21 = uVar31;
              if (uVar31 < 0x1000000) {
                if (local_f8 == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2c;
                  local_f8 = in_size;
                  goto LAB_0017b237;
                }
                pbVar1 = in + local_f8;
                local_f8 = local_f8 + 1;
                uVar15 = (uint)*pbVar1 | uVar15 << 8;
                uVar21 = uVar31 << 8;
              }
              uVar2 = *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6644);
              uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
              uVar24 = (int)uVar22 * 2;
              uVar35 = (ulong)uVar24;
              uVar32 = uVar15 - uVar31;
              if (uVar15 < uVar31) {
                *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6644) =
                     (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar18 = uVar33;
                uVar32 = uVar15;
              }
              else {
                uVar31 = uVar21 - uVar31;
                *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6644) = uVar2 - (uVar2 >> 5);
                uVar35 = (ulong)(uVar24 | 1);
                uVar18 = (ulong)((int)uVar33 + 1);
              }
switchD_0017835c_caseD_2d:
              uVar21 = uVar31;
              if (uVar31 < 0x1000000) {
                if (local_f8 == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2d;
                  local_f8 = in_size;
                  uVar33 = uVar18;
                  uVar22 = uVar35;
                  uVar15 = uVar32;
                  goto LAB_0017b237;
                }
                pbVar1 = in + local_f8;
                local_f8 = local_f8 + 1;
                uVar32 = (uint)*pbVar1 | uVar32 << 8;
                uVar21 = uVar31 << 8;
              }
              uVar2 = *(ushort *)((long)coder_ptr + uVar35 * 2 + 0x6644);
              uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
              uVar24 = (int)uVar35 * 2;
              uVar34 = (ulong)uVar24;
              uVar15 = uVar32 - uVar31;
              if (uVar32 < uVar31) {
                *(ushort *)((long)coder_ptr + uVar35 * 2 + 0x6644) =
                     (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar15 = uVar32;
              }
              else {
                uVar31 = uVar21 - uVar31;
                *(ushort *)((long)coder_ptr + uVar35 * 2 + 0x6644) = uVar2 - (uVar2 >> 5);
                uVar34 = (ulong)(uVar24 | 1);
                uVar18 = (ulong)((int)uVar18 + 2);
              }
switchD_0017835c_caseD_2e:
              uVar21 = uVar31;
              if (uVar31 < 0x1000000) {
                if (local_f8 == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2e;
                  local_f8 = in_size;
                  uVar33 = uVar18;
                  uVar22 = uVar34;
                  goto LAB_0017b237;
                }
                pbVar1 = in + local_f8;
                local_f8 = local_f8 + 1;
                uVar15 = (uint)*pbVar1 | uVar15 << 8;
                uVar21 = uVar31 << 8;
              }
              uVar2 = *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6644);
              uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
              uVar24 = (int)uVar34 * 2;
              uVar22 = (ulong)uVar24;
              uVar32 = uVar15 - uVar31;
              if (uVar15 < uVar31) {
                *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6644) =
                     (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar32 = uVar15;
              }
              else {
                uVar31 = uVar21 - uVar31;
                *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6644) = uVar2 - (uVar2 >> 5);
                uVar22 = (ulong)(uVar24 | 1);
                uVar18 = (ulong)((int)uVar18 + 4);
              }
switchD_0017835c_caseD_2f:
              uVar21 = uVar31;
              if (uVar31 < 0x1000000) {
                if (local_f8 == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x2f;
                  local_f8 = in_size;
                  uVar33 = uVar18;
                  uVar15 = uVar32;
                  goto LAB_0017b237;
                }
                pbVar1 = in + local_f8;
                local_f8 = local_f8 + 1;
                uVar32 = (uint)*pbVar1 | uVar32 << 8;
                uVar21 = uVar31 << 8;
              }
              uVar2 = *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6644);
              uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
              uVar15 = uVar32 - uVar31;
              if (uVar32 < uVar31) {
                sVar11 = (short)(0x800 - uVar2 >> 5);
                uVar15 = uVar32;
              }
              else {
                uVar31 = uVar21 - uVar31;
                sVar11 = -(uVar2 >> 5);
                uVar18 = (ulong)((int)uVar18 + 8);
              }
              *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6644) = sVar11 + uVar2;
              uVar34 = uVar22;
              if ((int)uVar18 != -1) goto switchD_0017a312_default;
              uVar33 = 0xffffffffffffffff;
              if (*(long *)((long)coder_ptr + 0x6e98) == -1) goto switchD_0017835c_caseD_30;
            }
            lVar29 = LZMA_DATA_ERROR;
            bVar12 = false;
            bVar13 = false;
            uVar18 = uVar33;
            uVar32 = uVar15;
            goto LAB_0017b246;
          }
          uVar31 = uVar19 - uVar31;
          *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6180) = uVar2 - (uVar2 >> 5);
          local_c8 = uVar24;
          if (local_a8 == 0) {
            lVar29 = LZMA_DATA_ERROR;
            local_a8 = 0;
            bVar12 = false;
            bVar13 = false;
            uVar15 = uVar32;
            break;
          }
switchD_0017835c_caseD_31:
          uVar15 = uVar32;
          uVar21 = uVar31;
          if (uVar31 < 0x1000000) {
            if (local_f8 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x31;
              local_f8 = in_size;
              goto LAB_0017b237;
            }
            pbVar1 = in + local_f8;
            local_f8 = local_f8 + 1;
            uVar15 = (uint)*pbVar1 | uVar32 << 8;
            uVar21 = uVar31 << 8;
          }
          uVar34 = (ulong)lVar28;
          uVar2 = *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6198);
          uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
          uVar32 = uVar15 - uVar31;
          if (uVar15 < uVar31) {
            *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6198) = (short)(0x800 - uVar2 >> 5) + uVar2
            ;
switchD_0017835c_caseD_33:
            uVar21 = uVar31;
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x33;
                local_f8 = in_size;
                goto LAB_0017b237;
              }
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar15 = (uint)*pbVar1 | uVar15 << 8;
              uVar21 = uVar31 << 8;
            }
            puVar25 = (ushort *)((long)coder_ptr + local_b8 * 2 + (ulong)lVar28 * 0x20 + 0x61e0);
            uVar2 = *puVar25;
            uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
            if (uVar15 < uVar31) {
              *puVar25 = (short)(0x800 - uVar2 >> 5) + uVar2;
              lVar28 = (uint)(STATE_SHORTREP_LIT < lVar28) * 2 + STATE_LIT_SHORTREP;
              uVar18 = uVar33;
switchD_0017835c_caseD_32:
              if (sVar26 != sVar20) {
                sVar17 = 0;
                if (sVar26 <= uVar18) {
                  sVar17 = sVar9;
                }
                puVar8[sVar26] = puVar8[sVar17 + sVar26 + ~uVar18];
                goto LAB_0017acd2;
              }
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x32;
              sVar26 = sVar20;
              uVar33 = uVar18;
              goto LAB_0017b237;
            }
            *puVar25 = uVar2 - (uVar2 >> 5);
            uVar32 = (uint)uVar33;
            uVar15 = uVar15 - uVar31;
            uVar31 = uVar21 - uVar31;
            uVar21 = local_c4;
          }
          else {
            uVar31 = uVar21 - uVar31;
            *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6198) = uVar2 - (uVar2 >> 5);
switchD_0017835c_caseD_34:
            uVar21 = (uint)uVar33;
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x34;
                local_f8 = in_size;
                uVar15 = uVar32;
                goto LAB_0017b237;
              }
              uVar31 = uVar31 << 8;
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar32 = (uint)*pbVar1 | uVar32 << 8;
            }
            uVar34 = (ulong)lVar28;
            uVar2 = *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x61b0);
            uVar24 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar15 = uVar32 - uVar24;
            if (uVar32 < uVar24) {
              *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x61b0) =
                   (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar15 = uVar32;
              uVar31 = uVar24;
              uVar32 = local_c4;
            }
            else {
              uVar31 = uVar31 - uVar24;
              *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x61b0) = uVar2 - (uVar2 >> 5);
switchD_0017835c_caseD_35:
              uVar32 = local_9c;
              if (uVar31 < 0x1000000) {
                if (local_f8 == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x35;
                  local_f8 = in_size;
                  goto LAB_0017b237;
                }
                uVar31 = uVar31 << 8;
                pbVar1 = in + local_f8;
                local_f8 = local_f8 + 1;
                uVar15 = (uint)*pbVar1 | uVar15 << 8;
              }
              uVar22 = (ulong)lVar28;
              uVar2 = *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x61c8);
              uVar24 = (uVar31 >> 0xb) * (uint)uVar2;
              uVar21 = (uint)uVar33;
              if (uVar15 < uVar24) {
                *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x61c8) =
                     (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar31 = uVar24;
                uVar32 = local_c8;
                local_c8 = local_c4;
              }
              else {
                *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x61c8) = uVar2 - (uVar2 >> 5);
                local_9c = local_c8;
                uVar15 = uVar15 - uVar24;
                uVar31 = uVar31 - uVar24;
                local_c8 = local_c4;
              }
            }
          }
          lVar28 = (uint)(STATE_SHORTREP_LIT < lVar28) * 3 + STATE_LIT_LONGREP;
          uVar33 = (ulong)uVar32;
          uVar22 = 1;
          local_c4 = uVar21;
switchD_0017835c_caseD_36:
          uVar21 = uVar31;
          if (uVar31 < 0x1000000) {
            if (local_f8 == in_size) {
              *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x36;
              local_f8 = in_size;
              goto LAB_0017b237;
            }
            pbVar1 = in + local_f8;
            local_f8 = local_f8 + 1;
            uVar15 = (uint)*pbVar1 | uVar15 << 8;
            uVar21 = uVar31 << 8;
          }
          uVar2 = *(ushort *)((long)coder_ptr + 0x6a68);
          uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
          uVar32 = uVar15 - uVar31;
          if (uVar15 < uVar31) {
            *(ushort *)((long)coder_ptr + 0x6a68) = (short)(0x800 - uVar2 >> 5) + uVar2;
switchD_0017835c_caseD_37:
            uVar21 = uVar31;
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x37;
                local_f8 = in_size;
                goto LAB_0017b237;
              }
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar15 = (uint)*pbVar1 | uVar15 << 8;
              uVar21 = uVar31 << 8;
            }
            puVar25 = (ushort *)((long)coder_ptr + uVar22 * 2 + local_b8 * 0x10 + 0x6a6c);
            uVar2 = *puVar25;
            uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
            uVar24 = (int)uVar22 * 2;
            uVar22 = (ulong)uVar24;
            uVar32 = uVar15 - uVar31;
            if (uVar15 < uVar31) {
              *puVar25 = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar32 = uVar15;
            }
            else {
              uVar31 = uVar21 - uVar31;
              *puVar25 = uVar2 - (uVar2 >> 5);
              uVar22 = (ulong)(uVar24 | 1);
            }
switchD_0017835c_caseD_38:
            uVar15 = uVar31;
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x38;
                local_f8 = in_size;
                uVar15 = uVar32;
                goto LAB_0017b237;
              }
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar32 = (uint)*pbVar1 | uVar32 << 8;
              uVar15 = uVar31 << 8;
            }
            puVar25 = (ushort *)((long)coder_ptr + uVar22 * 2 + local_b8 * 0x10 + 0x6a6c);
            uVar2 = *puVar25;
            uVar31 = (uVar15 >> 0xb) * (uint)uVar2;
            uVar21 = (int)uVar22 * 2;
            uVar22 = (ulong)uVar21;
            uVar24 = uVar32 - uVar31;
            if (uVar32 < uVar31) {
              *puVar25 = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar24 = uVar32;
            }
            else {
              uVar31 = uVar15 - uVar31;
              *puVar25 = uVar2 - (uVar2 >> 5);
              uVar22 = (ulong)(uVar21 | 1);
            }
switchD_0017835c_caseD_39:
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x39;
                local_f8 = in_size;
                uVar15 = uVar24;
                goto LAB_0017b237;
              }
              uVar31 = uVar31 << 8;
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar24 = (uint)*pbVar1 | uVar24 << 8;
            }
            puVar25 = (ushort *)((long)coder_ptr + uVar22 * 2 + local_b8 * 0x10 + 0x6a6c);
            uVar2 = *puVar25;
            uVar19 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar21 = (int)uVar22 * 2;
            uVar15 = uVar24 - uVar19;
            if (uVar24 < uVar19) {
              sVar11 = (short)(0x800 - uVar2 >> 5);
              uVar15 = uVar24;
            }
            else {
              uVar19 = uVar31 - uVar19;
              sVar11 = -(uVar2 >> 5);
              uVar21 = uVar21 | 1;
            }
            *puVar25 = sVar11 + uVar2;
            uVar32 = uVar21 - 6;
            uVar31 = uVar19;
LAB_0017a287:
            uVar34 = (ulong)uVar21;
            local_f0 = (ulong)uVar32;
            uVar18 = uVar33;
          }
          else {
            uVar31 = uVar21 - uVar31;
            *(ushort *)((long)coder_ptr + 0x6a68) = uVar2 - (uVar2 >> 5);
switchD_0017835c_caseD_3a:
            uVar15 = uVar32;
            uVar21 = uVar31;
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x3a;
                local_f8 = in_size;
                goto LAB_0017b237;
              }
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar15 = (uint)*pbVar1 | uVar32 << 8;
              uVar21 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)coder_ptr + 0x6a6a);
            uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
            uVar32 = uVar15 - uVar31;
            if (uVar15 < uVar31) {
              *(ushort *)((long)coder_ptr + 0x6a6a) = (short)(0x800 - uVar2 >> 5) + uVar2;
switchD_0017835c_caseD_3b:
              uVar21 = uVar31;
              if (uVar31 < 0x1000000) {
                if (local_f8 == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x3b;
                  local_f8 = in_size;
                  goto LAB_0017b237;
                }
                pbVar1 = in + local_f8;
                local_f8 = local_f8 + 1;
                uVar15 = (uint)*pbVar1 | uVar15 << 8;
                uVar21 = uVar31 << 8;
              }
              puVar25 = (ushort *)((long)coder_ptr + uVar22 * 2 + local_b8 * 0x10 + 0x6b6c);
              uVar2 = *puVar25;
              uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
              uVar24 = (int)uVar22 * 2;
              uVar22 = (ulong)uVar24;
              uVar32 = uVar15 - uVar31;
              if (uVar15 < uVar31) {
                *puVar25 = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar32 = uVar15;
              }
              else {
                uVar31 = uVar21 - uVar31;
                *puVar25 = uVar2 - (uVar2 >> 5);
                uVar22 = (ulong)(uVar24 | 1);
              }
switchD_0017835c_caseD_3c:
              uVar15 = uVar31;
              if (uVar31 < 0x1000000) {
                if (local_f8 == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x3c;
                  local_f8 = in_size;
                  uVar15 = uVar32;
                  goto LAB_0017b237;
                }
                pbVar1 = in + local_f8;
                local_f8 = local_f8 + 1;
                uVar32 = (uint)*pbVar1 | uVar32 << 8;
                uVar15 = uVar31 << 8;
              }
              puVar25 = (ushort *)((long)coder_ptr + uVar22 * 2 + local_b8 * 0x10 + 0x6b6c);
              uVar2 = *puVar25;
              uVar31 = (uVar15 >> 0xb) * (uint)uVar2;
              uVar21 = (int)uVar22 * 2;
              uVar22 = (ulong)uVar21;
              uVar24 = uVar32 - uVar31;
              if (uVar32 < uVar31) {
                *puVar25 = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar24 = uVar32;
              }
              else {
                uVar31 = uVar15 - uVar31;
                *puVar25 = uVar2 - (uVar2 >> 5);
                uVar22 = (ulong)(uVar21 | 1);
              }
switchD_0017835c_caseD_3d:
              if (uVar31 < 0x1000000) {
                if (local_f8 == in_size) {
                  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x3d;
                  local_f8 = in_size;
                  uVar15 = uVar24;
                  goto LAB_0017b237;
                }
                uVar31 = uVar31 << 8;
                pbVar1 = in + local_f8;
                local_f8 = local_f8 + 1;
                uVar24 = (uint)*pbVar1 | uVar24 << 8;
              }
              puVar25 = (ushort *)((long)coder_ptr + uVar22 * 2 + local_b8 * 0x10 + 0x6b6c);
              uVar2 = *puVar25;
              uVar32 = (uVar31 >> 0xb) * (uint)uVar2;
              uVar21 = (int)uVar22 * 2;
              uVar15 = uVar24 - uVar32;
              if (uVar24 < uVar32) {
                sVar11 = (short)(0x800 - uVar2 >> 5);
                uVar15 = uVar24;
                uVar31 = uVar32;
              }
              else {
                uVar31 = uVar31 - uVar32;
                sVar11 = -(uVar2 >> 5);
                uVar21 = uVar21 | 1;
              }
              *puVar25 = sVar11 + uVar2;
              uVar32 = uVar21 + 2;
              goto LAB_0017a287;
            }
            uVar31 = uVar21 - uVar31;
            *(ushort *)((long)coder_ptr + 0x6a6a) = uVar2 - (uVar2 >> 5);
            uVar34 = uVar22;
switchD_0017835c_caseD_3e:
            uVar21 = uVar31;
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x3e;
                local_f8 = in_size;
                uVar22 = uVar34;
                uVar15 = uVar32;
                goto LAB_0017b237;
              }
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar32 = (uint)*pbVar1 | uVar32 << 8;
              uVar21 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6c6c);
            uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
            uVar24 = (int)uVar34 * 2;
            uVar22 = (ulong)uVar24;
            uVar15 = uVar32 - uVar31;
            if (uVar32 < uVar31) {
              *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6c6c) =
                   (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar15 = uVar32;
            }
            else {
              uVar31 = uVar21 - uVar31;
              *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6c6c) = uVar2 - (uVar2 >> 5);
              uVar22 = (ulong)(uVar24 | 1);
            }
switchD_0017835c_caseD_3f:
            uVar21 = uVar31;
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x3f;
                local_f8 = in_size;
                goto LAB_0017b237;
              }
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar15 = (uint)*pbVar1 | uVar15 << 8;
              uVar21 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6c6c);
            uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
            uVar24 = (int)uVar22 * 2;
            uVar34 = (ulong)uVar24;
            uVar32 = uVar15 - uVar31;
            if (uVar15 < uVar31) {
              *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6c6c) =
                   (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar32 = uVar15;
            }
            else {
              uVar31 = uVar21 - uVar31;
              *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6c6c) = uVar2 - (uVar2 >> 5);
              uVar34 = (ulong)(uVar24 | 1);
            }
switchD_0017835c_caseD_40:
            uVar21 = uVar31;
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x40;
                local_f8 = in_size;
                uVar22 = uVar34;
                uVar15 = uVar32;
                goto LAB_0017b237;
              }
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar32 = (uint)*pbVar1 | uVar32 << 8;
              uVar21 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6c6c);
            uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
            uVar24 = (int)uVar34 * 2;
            uVar22 = (ulong)uVar24;
            uVar15 = uVar32 - uVar31;
            if (uVar32 < uVar31) {
              *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6c6c) =
                   (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar15 = uVar32;
            }
            else {
              uVar31 = uVar21 - uVar31;
              *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6c6c) = uVar2 - (uVar2 >> 5);
              uVar22 = (ulong)(uVar24 | 1);
            }
switchD_0017835c_caseD_41:
            uVar21 = uVar31;
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x41;
                local_f8 = in_size;
                goto LAB_0017b237;
              }
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar15 = (uint)*pbVar1 | uVar15 << 8;
              uVar21 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6c6c);
            uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
            uVar24 = (int)uVar22 * 2;
            uVar34 = (ulong)uVar24;
            uVar32 = uVar15 - uVar31;
            if (uVar15 < uVar31) {
              *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6c6c) =
                   (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar32 = uVar15;
            }
            else {
              uVar31 = uVar21 - uVar31;
              *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6c6c) = uVar2 - (uVar2 >> 5);
              uVar34 = (ulong)(uVar24 | 1);
            }
switchD_0017835c_caseD_42:
            uVar21 = uVar31;
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x42;
                local_f8 = in_size;
                uVar22 = uVar34;
                uVar15 = uVar32;
                goto LAB_0017b237;
              }
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar32 = (uint)*pbVar1 | uVar32 << 8;
              uVar21 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6c6c);
            uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
            uVar24 = (int)uVar34 * 2;
            uVar22 = (ulong)uVar24;
            uVar15 = uVar32 - uVar31;
            if (uVar32 < uVar31) {
              *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6c6c) =
                   (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar15 = uVar32;
            }
            else {
              uVar31 = uVar21 - uVar31;
              *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6c6c) = uVar2 - (uVar2 >> 5);
              uVar22 = (ulong)(uVar24 | 1);
            }
switchD_0017835c_caseD_43:
            uVar21 = uVar31;
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x43;
                local_f8 = in_size;
                goto LAB_0017b237;
              }
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar15 = (uint)*pbVar1 | uVar15 << 8;
              uVar21 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6c6c);
            uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
            uVar24 = (int)uVar22 * 2;
            uVar34 = (ulong)uVar24;
            uVar32 = uVar15 - uVar31;
            if (uVar15 < uVar31) {
              *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6c6c) =
                   (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar32 = uVar15;
            }
            else {
              uVar31 = uVar21 - uVar31;
              *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6c6c) = uVar2 - (uVar2 >> 5);
              uVar34 = (ulong)(uVar24 | 1);
            }
switchD_0017835c_caseD_44:
            uVar15 = uVar31;
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x44;
                local_f8 = in_size;
                uVar22 = uVar34;
                uVar15 = uVar32;
                goto LAB_0017b237;
              }
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar32 = (uint)*pbVar1 | uVar32 << 8;
              uVar15 = uVar31 << 8;
            }
            uVar2 = *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6c6c);
            uVar31 = (uVar15 >> 0xb) * (uint)uVar2;
            uVar21 = (int)uVar34 * 2;
            uVar22 = (ulong)uVar21;
            uVar24 = uVar32 - uVar31;
            if (uVar32 < uVar31) {
              *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6c6c) =
                   (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar24 = uVar32;
            }
            else {
              uVar31 = uVar15 - uVar31;
              *(ushort *)((long)coder_ptr + uVar34 * 2 + 0x6c6c) = uVar2 - (uVar2 >> 5);
              uVar22 = (ulong)(uVar21 | 1);
            }
switchD_0017835c_caseD_45:
            if (uVar31 < 0x1000000) {
              if (local_f8 == in_size) {
                *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x45;
                local_f8 = in_size;
                uVar15 = uVar24;
                goto LAB_0017b237;
              }
              uVar31 = uVar31 << 8;
              pbVar1 = in + local_f8;
              local_f8 = local_f8 + 1;
              uVar24 = (uint)*pbVar1 | uVar24 << 8;
            }
            uVar2 = *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6c6c);
            uVar32 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar21 = (int)uVar22 * 2;
            uVar15 = uVar24 - uVar32;
            if (uVar24 < uVar32) {
              sVar11 = (short)(0x800 - uVar2 >> 5);
              uVar15 = uVar24;
              uVar31 = uVar32;
            }
            else {
              uVar31 = uVar31 - uVar32;
              sVar11 = -(uVar2 >> 5);
              uVar21 = uVar21 | 1;
            }
            uVar34 = (ulong)uVar21;
            *(ushort *)((long)coder_ptr + uVar22 * 2 + 0x6c6c) = sVar11 + uVar2;
            local_f0 = (ulong)(uVar21 - 0xee);
            uVar18 = uVar33;
          }
LAB_0017b035:
          if ((uint)local_f0 < 2) {
            __assert_fail("len >= MATCH_LEN_MIN",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                          ,0x311,
                          "lzma_ret lzma_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                         );
          }
          uVar22 = uVar34;
          if (0x111 < (uint)local_f0) {
            __assert_fail("len <= MATCH_LEN_MAX",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                          ,0x312,
                          "lzma_ret lzma_decode(void *, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                         );
          }
switchD_0017835c_caseD_46:
          uVar33 = sVar20 - sVar26;
          if (local_f0 <= sVar20 - sVar26) {
            uVar33 = local_f0;
          }
          uVar34 = uVar33 & 0xffffffff;
          uVar32 = (uint)uVar33;
          uVar21 = (int)local_f0 - uVar32;
          if ((uint)uVar18 < uVar32) {
            do {
              sVar17 = sVar9;
              if (uVar18 < sVar26) {
                sVar17 = 0;
              }
              puVar8[sVar26] = puVar8[sVar26 + sVar17 + ~uVar18];
              sVar26 = sVar26 + 1;
              uVar32 = (int)uVar34 - 1;
              uVar34 = (ulong)uVar32;
            } while (uVar32 != 0);
          }
          else {
            if (uVar18 < sVar26) {
              __dest = puVar8 + sVar26;
              __src = __dest + ~uVar18;
LAB_0017b15b:
              memcpy(__dest,__src,uVar34);
            }
            else {
              if (local_a8 != sVar9) {
                __assert_fail("dict->full == dict->size",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_decoder.h"
                              ,0x9d,"_Bool dict_repeat(lzma_dict *, uint32_t, uint32_t *)");
              }
              iVar14 = ~(uint)uVar18 + (int)sVar26;
              uVar24 = -iVar14;
              if (uVar24 < uVar32) {
                memmove(puVar8 + sVar26,puVar8 + (uint)((int)sVar9 + iVar14),(ulong)uVar24);
                sVar26 = sVar26 + uVar24;
                uVar34 = (ulong)(uVar32 + iVar14);
                __dest = puVar8 + sVar26;
                __src = puVar8;
                goto LAB_0017b15b;
              }
              memmove(puVar8 + sVar26,puVar8 + (uint)((int)sVar9 + iVar14),uVar34);
            }
            sVar26 = sVar26 + uVar34;
          }
          if (local_a8 <= sVar26) {
            local_a8 = sVar26;
          }
          if (uVar21 != 0) goto LAB_0017b3c4;
          local_f0 = 0;
        }
        local_b8 = (ulong)(uVar3 & (uint)sVar26);
        uVar33 = uVar18;
      } while( true );
    case 2:
      goto switchD_0017835c_caseD_2;
    case 3:
      goto switchD_0017835c_caseD_3;
    case 4:
      goto switchD_0017835c_caseD_4;
    case 5:
      goto switchD_0017835c_caseD_5;
    case 6:
      goto switchD_0017835c_caseD_6;
    case 7:
      goto switchD_0017835c_caseD_7;
    case 8:
      goto switchD_0017835c_caseD_8;
    case 9:
      goto switchD_0017835c_caseD_9;
    case 10:
      goto switchD_0017835c_caseD_a;
    case 0xb:
      goto switchD_0017835c_caseD_b;
    case 0xc:
      goto switchD_0017835c_caseD_c;
    case 0xd:
      goto switchD_0017835c_caseD_d;
    case 0xe:
      goto switchD_0017835c_caseD_e;
    case 0xf:
      goto switchD_0017835c_caseD_f;
    case 0x10:
      goto switchD_0017835c_caseD_10;
    case 0x11:
      goto switchD_0017835c_caseD_11;
    case 0x12:
      goto switchD_0017835c_caseD_12;
    case 0x13:
      goto switchD_0017835c_caseD_13;
    case 0x14:
      goto switchD_0017835c_caseD_14;
    case 0x15:
      goto switchD_0017835c_caseD_15;
    case 0x16:
      goto switchD_0017835c_caseD_16;
    case 0x17:
      goto switchD_0017835c_caseD_17;
    case 0x18:
      goto switchD_0017835c_caseD_18;
    case 0x19:
      goto switchD_0017835c_caseD_19;
    case 0x1a:
      goto switchD_0017835c_caseD_1a;
    case 0x1b:
      goto switchD_0017835c_caseD_1b;
    case 0x1c:
      goto switchD_0017835c_caseD_1c;
    case 0x1d:
      goto switchD_0017835c_caseD_1d;
    case 0x1e:
      goto switchD_0017835c_caseD_1e;
    case 0x1f:
      goto switchD_0017835c_caseD_1f;
    case 0x20:
      goto switchD_0017835c_caseD_20;
    case 0x21:
      goto switchD_0017835c_caseD_21;
    case 0x22:
      goto switchD_0017835c_caseD_22;
    case 0x23:
      goto switchD_0017835c_caseD_23;
    case 0x24:
      goto switchD_0017835c_caseD_24;
    case 0x25:
      goto switchD_0017835c_caseD_25;
    case 0x26:
      goto switchD_0017835c_caseD_26;
    case 0x27:
      goto switchD_0017835c_caseD_27;
    case 0x28:
      goto switchD_0017835c_caseD_28;
    case 0x29:
      goto switchD_0017835c_caseD_29;
    case 0x2a:
      goto switchD_0017835c_caseD_2a;
    case 0x2b:
      goto switchD_0017835c_caseD_2b;
    case 0x2c:
      goto switchD_0017835c_caseD_2c;
    case 0x2d:
      goto switchD_0017835c_caseD_2d;
    case 0x2e:
      goto switchD_0017835c_caseD_2e;
    case 0x2f:
      goto switchD_0017835c_caseD_2f;
    case 0x30:
switchD_0017835c_caseD_30:
      lVar29 = LZMA_STREAM_END;
      uVar18 = uVar33;
      if (uVar31 < 0x1000000) {
        bVar13 = true;
        if (local_f8 == in_size) {
          *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x30;
          local_f8 = in_size;
LAB_0017b237:
          bVar13 = false;
          bVar12 = true;
          lVar29 = LZMA_OK;
          uVar18 = uVar33;
          uVar32 = uVar15;
        }
        else {
          uVar31 = uVar31 << 8;
          pbVar1 = in + local_f8;
          local_f8 = local_f8 + 1;
          bVar12 = false;
          uVar32 = (uint)*pbVar1 | uVar15 << 8;
        }
      }
      else {
        bVar13 = true;
        bVar12 = false;
        uVar32 = uVar15;
      }
LAB_0017b246:
      uVar21 = (uint)local_f0;
      uVar15 = uVar32;
      break;
    case 0x31:
      goto switchD_0017835c_caseD_31;
    case 0x32:
      goto switchD_0017835c_caseD_32;
    case 0x33:
      goto switchD_0017835c_caseD_33;
    case 0x34:
      goto switchD_0017835c_caseD_34;
    case 0x35:
      goto switchD_0017835c_caseD_35;
    case 0x36:
      goto switchD_0017835c_caseD_36;
    case 0x37:
      goto switchD_0017835c_caseD_37;
    case 0x38:
      goto switchD_0017835c_caseD_38;
    case 0x39:
      goto switchD_0017835c_caseD_39;
    case 0x3a:
      goto switchD_0017835c_caseD_3a;
    case 0x3b:
      goto switchD_0017835c_caseD_3b;
    case 0x3c:
      goto switchD_0017835c_caseD_3c;
    case 0x3d:
      goto switchD_0017835c_caseD_3d;
    case 0x3e:
      goto switchD_0017835c_caseD_3e;
    case 0x3f:
      goto switchD_0017835c_caseD_3f;
    case 0x40:
      goto switchD_0017835c_caseD_40;
    case 0x41:
      goto switchD_0017835c_caseD_41;
    case 0x42:
      goto switchD_0017835c_caseD_42;
    case 0x43:
      goto switchD_0017835c_caseD_43;
    case 0x44:
      goto switchD_0017835c_caseD_44;
    case 0x45:
      goto switchD_0017835c_caseD_45;
    case 0x46:
      goto switchD_0017835c_caseD_46;
    }
    goto LAB_0017b24b;
  }
LAB_00178371:
  uVar18 = uVar33;
  if (uVar31 < 0x1000000) {
    if (local_f8 != in_size) {
      uVar31 = uVar31 << 8;
      pbVar1 = in + local_f8;
      local_f8 = local_f8 + 1;
      uVar15 = (uint)*pbVar1 | uVar15 << 8;
      goto LAB_0017839e;
    }
    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0;
    local_f8 = in_size;
  }
  else {
LAB_0017839e:
    *(undefined4 *)((long)coder_ptr + 0x6ea0) = 1;
  }
LAB_001783b6:
  bVar13 = false;
  bVar12 = true;
  lVar29 = LZMA_OK;
LAB_0017b24b:
  dictptr->pos = sVar26;
  dictptr->full = local_a8;
  *(uint *)((long)coder_ptr + 0x6e6c) = uVar31;
  *(uint *)((long)coder_ptr + 0x6e70) = uVar15;
  *(undefined4 *)((long)coder_ptr + 0x6e74) = 0;
  *in_pos = local_f8;
  *(lzma_lzma_state *)((long)coder_ptr + 0x6e78) = lVar28;
  *(int *)((long)coder_ptr + 0x6e7c) = (int)uVar18;
  *(uint *)((long)coder_ptr + 0x6e80) = local_c4;
  *(uint *)((long)coder_ptr + 0x6e84) = local_c8;
  *(uint *)((long)coder_ptr + 0x6e88) = local_9c;
  *(void **)((long)coder_ptr + 0x6ea8) = pvVar23;
  *(int *)((long)coder_ptr + 0x6eb0) = (int)uVar22;
  *(uint *)((long)coder_ptr + 0x6eb4) = uVar30;
  *(uint *)((long)coder_ptr + 0x6eb8) = uVar16;
  *(uint *)((long)coder_ptr + 0x6ebc) = uVar21;
  if ((*(long *)((long)coder_ptr + 0x6e98) == -1) ||
     (lVar27 = *(long *)((long)coder_ptr + 0x6e98) + (sVar6 - sVar26),
     *(long *)((long)coder_ptr + 0x6e98) = lVar27, !bVar12 || lVar27 != 0)) {
    if (!bVar13) {
      return lVar29;
    }
  }
  else {
    if (*(int *)((long)coder_ptr + 0x6ea0) == 0) {
      return LZMA_OK;
    }
    if (*(int *)((long)coder_ptr + 0x6ea0) != 1) {
      return LZMA_DATA_ERROR;
    }
  }
  *(undefined8 *)((long)coder_ptr + 0x6e6c) = 0xffffffff;
  *(undefined4 *)((long)coder_ptr + 0x6e74) = 5;
  return (uint)(uVar15 != 0) * 8 + LZMA_STREAM_END;
LAB_0017b3c4:
  *(undefined4 *)((long)coder_ptr + 0x6ea0) = 0x46;
  bVar13 = false;
  bVar12 = true;
  lVar29 = LZMA_OK;
  goto LAB_0017b24b;
}

Assistant:

static lzma_ret
lzma_decode(void *coder_ptr, lzma_dict *restrict dictptr,
		const uint8_t *restrict in,
		size_t *restrict in_pos, size_t in_size)
{
	lzma_lzma1_decoder *restrict coder = coder_ptr;

	////////////////////
	// Initialization //
	////////////////////

	{
		const lzma_ret ret = rc_read_init(
				&coder->rc, in, in_pos, in_size);
		if (ret != LZMA_STREAM_END)
			return ret;
	}

	///////////////
	// Variables //
	///////////////

	// Making local copies of often-used variables improves both
	// speed and readability.

	lzma_dict dict = *dictptr;

	const size_t dict_start = dict.pos;

	// Range decoder
	rc_to_local(coder->rc, *in_pos);

	// State
	uint32_t state = coder->state;
	uint32_t rep0 = coder->rep0;
	uint32_t rep1 = coder->rep1;
	uint32_t rep2 = coder->rep2;
	uint32_t rep3 = coder->rep3;

	const uint32_t pos_mask = coder->pos_mask;

	// These variables are actually needed only if we last time ran
	// out of input in the middle of the decoder loop.
	probability *probs = coder->probs;
	uint32_t symbol = coder->symbol;
	uint32_t limit = coder->limit;
	uint32_t offset = coder->offset;
	uint32_t len = coder->len;

	const uint32_t literal_pos_mask = coder->literal_pos_mask;
	const uint32_t literal_context_bits = coder->literal_context_bits;

	// Temporary variables
	uint32_t pos_state = dict.pos & pos_mask;

	lzma_ret ret = LZMA_OK;

	// If uncompressed size is known, there must be no end of payload
	// marker.
	const bool no_eopm = coder->uncompressed_size
			!= LZMA_VLI_UNKNOWN;
	if (no_eopm && coder->uncompressed_size < dict.limit - dict.pos)
		dict.limit = dict.pos + (size_t)(coder->uncompressed_size);

	// The main decoder loop. The "switch" is used to restart the decoder at
	// correct location. Once restarted, the "switch" is no longer used.
	switch (coder->sequence)
	while (true) {
		// Calculate new pos_state. This is skipped on the first loop
		// since we already calculated it when setting up the local
		// variables.
		pos_state = dict.pos & pos_mask;

	case SEQ_NORMALIZE:
	case SEQ_IS_MATCH:
		if (unlikely(no_eopm && dict.pos == dict.limit))
			break;

		rc_if_0(coder->is_match[state][pos_state], SEQ_IS_MATCH) {
			rc_update_0(coder->is_match[state][pos_state]);

			// It's a literal i.e. a single 8-bit byte.

			probs = literal_subcoder(coder->literal,
					literal_context_bits, literal_pos_mask,
					dict.pos, dict_get(&dict, 0));
			symbol = 1;

			if (is_literal_state(state)) {
				// Decode literal without match byte.
#ifdef HAVE_SMALL
	case SEQ_LITERAL:
				do {
					rc_bit(probs[symbol], , , SEQ_LITERAL);
				} while (symbol < (1 << 8));
#else
				rc_bit_case(probs[symbol], , , SEQ_LITERAL0);
				rc_bit_case(probs[symbol], , , SEQ_LITERAL1);
				rc_bit_case(probs[symbol], , , SEQ_LITERAL2);
				rc_bit_case(probs[symbol], , , SEQ_LITERAL3);
				rc_bit_case(probs[symbol], , , SEQ_LITERAL4);
				rc_bit_case(probs[symbol], , , SEQ_LITERAL5);
				rc_bit_case(probs[symbol], , , SEQ_LITERAL6);
				rc_bit_case(probs[symbol], , , SEQ_LITERAL7);
#endif
			} else {
				// Decode literal with match byte.
				//
				// We store the byte we compare against
				// ("match byte") to "len" to minimize the
				// number of variables we need to store
				// between decoder calls.
				len = dict_get(&dict, rep0) << 1;

				// The usage of "offset" allows omitting some
				// branches, which should give tiny speed
				// improvement on some CPUs. "offset" gets
				// set to zero if match_bit didn't match.
				offset = 0x100;

#ifdef HAVE_SMALL
	case SEQ_LITERAL_MATCHED:
				do {
					const uint32_t match_bit
							= len & offset;
					const uint32_t subcoder_index
							= offset + match_bit
							+ symbol;

					rc_bit(probs[subcoder_index],
							offset &= ~match_bit,
							offset &= match_bit,
							SEQ_LITERAL_MATCHED);

					// It seems to be faster to do this
					// here instead of putting it to the
					// beginning of the loop and then
					// putting the "case" in the middle
					// of the loop.
					len <<= 1;

				} while (symbol < (1 << 8));
#else
				// Unroll the loop.
				uint32_t match_bit;
				uint32_t subcoder_index;

#	define d(seq) \
		case seq: \
			match_bit = len & offset; \
			subcoder_index = offset + match_bit + symbol; \
			rc_bit(probs[subcoder_index], \
					offset &= ~match_bit, \
					offset &= match_bit, \
					seq)

				d(SEQ_LITERAL_MATCHED0);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED1);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED2);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED3);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED4);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED5);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED6);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED7);
#	undef d
#endif
			}

			//update_literal(state);
			// Use a lookup table to update to literal state,
			// since compared to other state updates, this would
			// need two branches.
			static const lzma_lzma_state next_state[] = {
				STATE_LIT_LIT,
				STATE_LIT_LIT,
				STATE_LIT_LIT,
				STATE_LIT_LIT,
				STATE_MATCH_LIT_LIT,
				STATE_REP_LIT_LIT,
				STATE_SHORTREP_LIT_LIT,
				STATE_MATCH_LIT,
				STATE_REP_LIT,
				STATE_SHORTREP_LIT,
				STATE_MATCH_LIT,
				STATE_REP_LIT
			};
			state = next_state[state];

	case SEQ_LITERAL_WRITE:
			if (unlikely(dict_put(&dict, symbol))) {
				coder->sequence = SEQ_LITERAL_WRITE;
				goto out;
			}

			continue;
		}

		// Instead of a new byte we are going to get a byte range
		// (distance and length) which will be repeated from our
		// output history.

		rc_update_1(coder->is_match[state][pos_state]);

	case SEQ_IS_REP:
		rc_if_0(coder->is_rep[state], SEQ_IS_REP) {
			// Not a repeated match
			rc_update_0(coder->is_rep[state]);
			update_match(state);

			// The latest three match distances are kept in
			// memory in case there are repeated matches.
			rep3 = rep2;
			rep2 = rep1;
			rep1 = rep0;

			// Decode the length of the match.
			len_decode(len, coder->match_len_decoder,
					pos_state, SEQ_MATCH_LEN);

			// Prepare to decode the highest two bits of the
			// match distance.
			probs = coder->dist_slot[get_dist_state(len)];
			symbol = 1;

#ifdef HAVE_SMALL
	case SEQ_DIST_SLOT:
			do {
				rc_bit(probs[symbol], , , SEQ_DIST_SLOT);
			} while (symbol < DIST_SLOTS);
#else
			rc_bit_case(probs[symbol], , , SEQ_DIST_SLOT0);
			rc_bit_case(probs[symbol], , , SEQ_DIST_SLOT1);
			rc_bit_case(probs[symbol], , , SEQ_DIST_SLOT2);
			rc_bit_case(probs[symbol], , , SEQ_DIST_SLOT3);
			rc_bit_case(probs[symbol], , , SEQ_DIST_SLOT4);
			rc_bit_case(probs[symbol], , , SEQ_DIST_SLOT5);
#endif
			// Get rid of the highest bit that was needed for
			// indexing of the probability array.
			symbol -= DIST_SLOTS;
			assert(symbol <= 63);

			if (symbol < DIST_MODEL_START) {
				// Match distances [0, 3] have only two bits.
				rep0 = symbol;
			} else {
				// Decode the lowest [1, 29] bits of
				// the match distance.
				limit = (symbol >> 1) - 1;
				assert(limit >= 1 && limit <= 30);
				rep0 = 2 + (symbol & 1);

				if (symbol < DIST_MODEL_END) {
					// Prepare to decode the low bits for
					// a distance of [4, 127].
					assert(limit <= 5);
					rep0 <<= limit;
					assert(rep0 <= 96);
					// -1 is fine, because we start
					// decoding at probs[1], not probs[0].
					// NOTE: This violates the C standard,
					// since we are doing pointer
					// arithmetic past the beginning of
					// the array.
					assert((int32_t)(rep0 - symbol - 1)
							>= -1);
					assert((int32_t)(rep0 - symbol - 1)
							<= 82);
					probs = coder->pos_special + rep0
							- symbol - 1;
					symbol = 1;
					offset = 0;
	case SEQ_DIST_MODEL:
#ifdef HAVE_SMALL
					do {
						rc_bit(probs[symbol], ,
							rep0 += 1 << offset,
							SEQ_DIST_MODEL);
					} while (++offset < limit);
#else
					switch (limit) {
					case 5:
						assert(offset == 0);
						rc_bit(probs[symbol], ,
							rep0 += 1,
							SEQ_DIST_MODEL);
						++offset;
						--limit;
					case 4:
						rc_bit(probs[symbol], ,
							rep0 += 1 << offset,
							SEQ_DIST_MODEL);
						++offset;
						--limit;
					case 3:
						rc_bit(probs[symbol], ,
							rep0 += 1 << offset,
							SEQ_DIST_MODEL);
						++offset;
						--limit;
					case 2:
						rc_bit(probs[symbol], ,
							rep0 += 1 << offset,
							SEQ_DIST_MODEL);
						++offset;
						--limit;
					case 1:
						// We need "symbol" only for
						// indexing the probability
						// array, thus we can use
						// rc_bit_last() here to omit
						// the unneeded updating of
						// "symbol".
						rc_bit_last(probs[symbol], ,
							rep0 += 1 << offset,
							SEQ_DIST_MODEL);
					}
#endif
				} else {
					// The distance is >= 128. Decode the
					// lower bits without probabilities
					// except the lowest four bits.
					assert(symbol >= 14);
					assert(limit >= 6);
					limit -= ALIGN_BITS;
					assert(limit >= 2);
	case SEQ_DIRECT:
					// Not worth manual unrolling
					do {
						rc_direct(rep0, SEQ_DIRECT);
					} while (--limit > 0);

					// Decode the lowest four bits using
					// probabilities.
					rep0 <<= ALIGN_BITS;
					symbol = 1;
#ifdef HAVE_SMALL
					offset = 0;
	case SEQ_ALIGN:
					do {
						rc_bit(coder->pos_align[
								symbol], ,
							rep0 += 1 << offset,
							SEQ_ALIGN);
					} while (++offset < ALIGN_BITS);
#else
	case SEQ_ALIGN0:
					rc_bit(coder->pos_align[symbol], ,
							rep0 += 1, SEQ_ALIGN0);
	case SEQ_ALIGN1:
					rc_bit(coder->pos_align[symbol], ,
							rep0 += 2, SEQ_ALIGN1);
	case SEQ_ALIGN2:
					rc_bit(coder->pos_align[symbol], ,
							rep0 += 4, SEQ_ALIGN2);
	case SEQ_ALIGN3:
					// Like in SEQ_DIST_MODEL, we don't
					// need "symbol" for anything else
					// than indexing the probability array.
					rc_bit_last(coder->pos_align[symbol], ,
							rep0 += 8, SEQ_ALIGN3);
#endif

					if (rep0 == UINT32_MAX) {
						// End of payload marker was
						// found. It must not be
						// present if uncompressed
						// size is known.
						if (coder->uncompressed_size
						!= LZMA_VLI_UNKNOWN) {
							ret = LZMA_DATA_ERROR;
							goto out;
						}

	case SEQ_EOPM:
						// LZMA1 stream with
						// end-of-payload marker.
						rc_normalize(SEQ_EOPM);
						ret = LZMA_STREAM_END;
						goto out;
					}
				}
			}

			// Validate the distance we just decoded.
			if (unlikely(!dict_is_distance_valid(&dict, rep0))) {
				ret = LZMA_DATA_ERROR;
				goto out;
			}

		} else {
			rc_update_1(coder->is_rep[state]);

			// Repeated match
			//
			// The match distance is a value that we have had
			// earlier. The latest four match distances are
			// available as rep0, rep1, rep2 and rep3. We will
			// now decode which of them is the new distance.
			//
			// There cannot be a match if we haven't produced
			// any output, so check that first.
			if (unlikely(!dict_is_distance_valid(&dict, 0))) {
				ret = LZMA_DATA_ERROR;
				goto out;
			}

	case SEQ_IS_REP0:
			rc_if_0(coder->is_rep0[state], SEQ_IS_REP0) {
				rc_update_0(coder->is_rep0[state]);
				// The distance is rep0.

	case SEQ_IS_REP0_LONG:
				rc_if_0(coder->is_rep0_long[state][pos_state],
						SEQ_IS_REP0_LONG) {
					rc_update_0(coder->is_rep0_long[
							state][pos_state]);

					update_short_rep(state);

	case SEQ_SHORTREP:
					if (unlikely(dict_put(&dict, dict_get(
							&dict, rep0)))) {
						coder->sequence = SEQ_SHORTREP;
						goto out;
					}

					continue;
				}

				// Repeating more than one byte at
				// distance of rep0.
				rc_update_1(coder->is_rep0_long[
						state][pos_state]);

			} else {
				rc_update_1(coder->is_rep0[state]);

	case SEQ_IS_REP1:
				// The distance is rep1, rep2 or rep3. Once
				// we find out which one of these three, it
				// is stored to rep0 and rep1, rep2 and rep3
				// are updated accordingly.
				rc_if_0(coder->is_rep1[state], SEQ_IS_REP1) {
					rc_update_0(coder->is_rep1[state]);

					const uint32_t distance = rep1;
					rep1 = rep0;
					rep0 = distance;

				} else {
					rc_update_1(coder->is_rep1[state]);
	case SEQ_IS_REP2:
					rc_if_0(coder->is_rep2[state],
							SEQ_IS_REP2) {
						rc_update_0(coder->is_rep2[
								state]);

						const uint32_t distance = rep2;
						rep2 = rep1;
						rep1 = rep0;
						rep0 = distance;

					} else {
						rc_update_1(coder->is_rep2[
								state]);

						const uint32_t distance = rep3;
						rep3 = rep2;
						rep2 = rep1;
						rep1 = rep0;
						rep0 = distance;
					}
				}
			}

			update_long_rep(state);

			// Decode the length of the repeated match.
			len_decode(len, coder->rep_len_decoder,
					pos_state, SEQ_REP_LEN);
		}

		/////////////////////////////////
		// Repeat from history buffer. //
		/////////////////////////////////

		// The length is always between these limits. There is no way
		// to trigger the algorithm to set len outside this range.
		assert(len >= MATCH_LEN_MIN);
		assert(len <= MATCH_LEN_MAX);

	case SEQ_COPY:
		// Repeat len bytes from distance of rep0.
		if (unlikely(dict_repeat(&dict, rep0, &len))) {
			coder->sequence = SEQ_COPY;
			goto out;
		}
	}

	rc_normalize(SEQ_NORMALIZE);
	coder->sequence = SEQ_IS_MATCH;

out:
	// Save state

	// NOTE: Must not copy dict.limit.
	dictptr->pos = dict.pos;
	dictptr->full = dict.full;

	rc_from_local(coder->rc, *in_pos);

	coder->state = state;
	coder->rep0 = rep0;
	coder->rep1 = rep1;
	coder->rep2 = rep2;
	coder->rep3 = rep3;

	coder->probs = probs;
	coder->symbol = symbol;
	coder->limit = limit;
	coder->offset = offset;
	coder->len = len;

	// Update the remaining amount of uncompressed data if uncompressed
	// size was known.
	if (coder->uncompressed_size != LZMA_VLI_UNKNOWN) {
		coder->uncompressed_size -= dict.pos - dict_start;

		// Since there cannot be end of payload marker if the
		// uncompressed size was known, we check here if we
		// finished decoding.
		if (coder->uncompressed_size == 0 && ret == LZMA_OK
				&& coder->sequence != SEQ_NORMALIZE)
			ret = coder->sequence == SEQ_IS_MATCH
					? LZMA_STREAM_END : LZMA_DATA_ERROR;
	}

	// We can do an additional check in the range decoder to catch some
	// corrupted files.
	if (ret == LZMA_STREAM_END) {
		if (!rc_is_finished(coder->rc))
			ret = LZMA_DATA_ERROR;

		// Reset the range decoder so that it is ready to reinitialize
		// for a new LZMA2 chunk.
		rc_reset(coder->rc);
	}

	return ret;
}